

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  RayQueryContext *pRVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar35;
  bool bVar36;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar56 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar102;
  float fVar107;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float t1;
  undefined4 uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vfloat4 b0;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vfloat4 b0_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  vfloat4 a0_3;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  vfloat4 a0_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar195 [16];
  float fVar205;
  float fVar207;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar209;
  float fVar210;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  vfloat4 a0_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  RayQueryContext *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar31;
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  
  PVar7 = prim[1];
  uVar35 = (ulong)(byte)PVar7;
  fVar209 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar46 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar44 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  fVar120 = fVar209 * auVar44._0_4_;
  fVar102 = fVar209 * auVar46._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar73 = vpmovsxbd_avx2(auVar43);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar71 = vpmovsxbd_avx2(auVar55);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar84 = vpmovsxbd_avx2(auVar4);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar35 * 0xb + 6);
  auVar85 = vpmovsxbd_avx2(auVar54);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar77 = vpmovsxbd_avx2(auVar53);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vcvtdq2ps_avx(auVar77);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar35 + 6);
  auVar72 = vpmovsxbd_avx2(auVar52);
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar38 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar74 = vpmovsxbd_avx2(auVar5);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar38 + uVar35 + 6);
  auVar75 = vpmovsxbd_avx2(auVar51);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar30 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar30 + 6);
  auVar70 = vpmovsxbd_avx2(auVar6);
  auVar76 = vcvtdq2ps_avx(auVar70);
  auVar129._4_4_ = fVar102;
  auVar129._0_4_ = fVar102;
  auVar129._8_4_ = fVar102;
  auVar129._12_4_ = fVar102;
  auVar129._16_4_ = fVar102;
  auVar129._20_4_ = fVar102;
  auVar129._24_4_ = fVar102;
  auVar129._28_4_ = fVar102;
  auVar234._8_4_ = 1;
  auVar234._0_8_ = 0x100000001;
  auVar234._12_4_ = 1;
  auVar234._16_4_ = 1;
  auVar234._20_4_ = 1;
  auVar234._24_4_ = 1;
  auVar234._28_4_ = 1;
  auVar68 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar79 = ZEXT1632(CONCAT412(fVar209 * auVar46._12_4_,
                               CONCAT48(fVar209 * auVar46._8_4_,
                                        CONCAT44(fVar209 * auVar46._4_4_,fVar102))));
  auVar78 = vpermps_avx2(auVar234,auVar79);
  auVar69 = vpermps_avx512vl(auVar68,auVar79);
  fVar102 = auVar69._0_4_;
  fVar205 = auVar69._4_4_;
  auVar79._4_4_ = fVar205 * auVar84._4_4_;
  auVar79._0_4_ = fVar102 * auVar84._0_4_;
  fVar207 = auVar69._8_4_;
  auVar79._8_4_ = fVar207 * auVar84._8_4_;
  fVar107 = auVar69._12_4_;
  auVar79._12_4_ = fVar107 * auVar84._12_4_;
  fVar108 = auVar69._16_4_;
  auVar79._16_4_ = fVar108 * auVar84._16_4_;
  fVar109 = auVar69._20_4_;
  auVar79._20_4_ = fVar109 * auVar84._20_4_;
  fVar110 = auVar69._24_4_;
  auVar79._24_4_ = fVar110 * auVar84._24_4_;
  auVar79._28_4_ = auVar77._28_4_;
  auVar77._4_4_ = auVar72._4_4_ * fVar205;
  auVar77._0_4_ = auVar72._0_4_ * fVar102;
  auVar77._8_4_ = auVar72._8_4_ * fVar207;
  auVar77._12_4_ = auVar72._12_4_ * fVar107;
  auVar77._16_4_ = auVar72._16_4_ * fVar108;
  auVar77._20_4_ = auVar72._20_4_ * fVar109;
  auVar77._24_4_ = auVar72._24_4_ * fVar110;
  auVar77._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar76._4_4_ * fVar205;
  auVar70._0_4_ = auVar76._0_4_ * fVar102;
  auVar70._8_4_ = auVar76._8_4_ * fVar207;
  auVar70._12_4_ = auVar76._12_4_ * fVar107;
  auVar70._16_4_ = auVar76._16_4_ * fVar108;
  auVar70._20_4_ = auVar76._20_4_ * fVar109;
  auVar70._24_4_ = auVar76._24_4_ * fVar110;
  auVar70._28_4_ = auVar69._28_4_;
  auVar43 = vfmadd231ps_fma(auVar79,auVar78,auVar71);
  auVar55 = vfmadd231ps_fma(auVar77,auVar78,auVar86);
  auVar4 = vfmadd231ps_fma(auVar70,auVar75,auVar78);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar129,auVar73);
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar129,auVar85);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar74,auVar129);
  auVar141._4_4_ = fVar120;
  auVar141._0_4_ = fVar120;
  auVar141._8_4_ = fVar120;
  auVar141._12_4_ = fVar120;
  auVar141._16_4_ = fVar120;
  auVar141._20_4_ = fVar120;
  auVar141._24_4_ = fVar120;
  auVar141._28_4_ = fVar120;
  auVar70 = ZEXT1632(CONCAT412(fVar209 * auVar44._12_4_,
                               CONCAT48(fVar209 * auVar44._8_4_,
                                        CONCAT44(fVar209 * auVar44._4_4_,fVar120))));
  auVar77 = vpermps_avx2(auVar234,auVar70);
  auVar70 = vpermps_avx512vl(auVar68,auVar70);
  fVar209 = auVar70._0_4_;
  fVar102 = auVar70._4_4_;
  auVar78._4_4_ = fVar102 * auVar84._4_4_;
  auVar78._0_4_ = fVar209 * auVar84._0_4_;
  fVar205 = auVar70._8_4_;
  auVar78._8_4_ = fVar205 * auVar84._8_4_;
  fVar207 = auVar70._12_4_;
  auVar78._12_4_ = fVar207 * auVar84._12_4_;
  fVar107 = auVar70._16_4_;
  auVar78._16_4_ = fVar107 * auVar84._16_4_;
  fVar108 = auVar70._20_4_;
  auVar78._20_4_ = fVar108 * auVar84._20_4_;
  fVar109 = auVar70._24_4_;
  auVar78._24_4_ = fVar109 * auVar84._24_4_;
  auVar78._28_4_ = 1;
  auVar68._4_4_ = auVar72._4_4_ * fVar102;
  auVar68._0_4_ = auVar72._0_4_ * fVar209;
  auVar68._8_4_ = auVar72._8_4_ * fVar205;
  auVar68._12_4_ = auVar72._12_4_ * fVar207;
  auVar68._16_4_ = auVar72._16_4_ * fVar107;
  auVar68._20_4_ = auVar72._20_4_ * fVar108;
  auVar68._24_4_ = auVar72._24_4_ * fVar109;
  auVar68._28_4_ = auVar84._28_4_;
  auVar72._4_4_ = auVar76._4_4_ * fVar102;
  auVar72._0_4_ = auVar76._0_4_ * fVar209;
  auVar72._8_4_ = auVar76._8_4_ * fVar205;
  auVar72._12_4_ = auVar76._12_4_ * fVar207;
  auVar72._16_4_ = auVar76._16_4_ * fVar107;
  auVar72._20_4_ = auVar76._20_4_ * fVar108;
  auVar72._24_4_ = auVar76._24_4_ * fVar109;
  auVar72._28_4_ = auVar70._28_4_;
  auVar54 = vfmadd231ps_fma(auVar78,auVar77,auVar71);
  auVar53 = vfmadd231ps_fma(auVar68,auVar77,auVar86);
  auVar52 = vfmadd231ps_fma(auVar72,auVar77,auVar75);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar141,auVar73);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar141,auVar85);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar141,auVar74);
  auVar73 = vandps_avx(ZEXT1632(auVar43),auVar87);
  auVar89._8_4_ = 0x219392ef;
  auVar89._0_8_ = 0x219392ef219392ef;
  auVar89._12_4_ = 0x219392ef;
  auVar89._16_4_ = 0x219392ef;
  auVar89._20_4_ = 0x219392ef;
  auVar89._24_4_ = 0x219392ef;
  auVar89._28_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar73,auVar89,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar69._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar43._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar43._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar43._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar43._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar55),auVar87);
  uVar38 = vcmpps_avx512vl(auVar73,auVar89,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar80._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar55._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar55._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar55._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar55._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar4),auVar87);
  uVar38 = vcmpps_avx512vl(auVar73,auVar89,1);
  bVar36 = (bool)((byte)uVar38 & 1);
  auVar73._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar4._0_4_;
  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar4._4_4_;
  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar4._8_4_;
  bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar4._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar71 = vrcp14ps_avx512vl(auVar69);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar69,auVar71,auVar88);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar80);
  auVar55 = vfnmadd213ps_fma(auVar80,auVar71,auVar88);
  auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar73);
  auVar4 = vfnmadd213ps_fma(auVar73,auVar71,auVar88);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar71,auVar71);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar54));
  auVar74._4_4_ = auVar43._4_4_ * auVar73._4_4_;
  auVar74._0_4_ = auVar43._0_4_ * auVar73._0_4_;
  auVar74._8_4_ = auVar43._8_4_ * auVar73._8_4_;
  auVar74._12_4_ = auVar43._12_4_ * auVar73._12_4_;
  auVar74._16_4_ = auVar73._16_4_ * 0.0;
  auVar74._20_4_ = auVar73._20_4_ * 0.0;
  auVar74._24_4_ = auVar73._24_4_ * 0.0;
  auVar74._28_4_ = auVar73._28_4_;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar54));
  auVar72 = vpbroadcastd_avx512vl();
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar83._0_4_ = auVar43._0_4_ * auVar73._0_4_;
  auVar83._4_4_ = auVar43._4_4_ * auVar73._4_4_;
  auVar83._8_4_ = auVar43._8_4_ * auVar73._8_4_;
  auVar83._12_4_ = auVar43._12_4_ * auVar73._12_4_;
  auVar83._16_4_ = auVar73._16_4_ * 0.0;
  auVar83._20_4_ = auVar73._20_4_ * 0.0;
  auVar83._24_4_ = auVar73._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar35 * -2 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar53));
  auVar75._4_4_ = auVar55._4_4_ * auVar73._4_4_;
  auVar75._0_4_ = auVar55._0_4_ * auVar73._0_4_;
  auVar75._8_4_ = auVar55._8_4_ * auVar73._8_4_;
  auVar75._12_4_ = auVar55._12_4_ * auVar73._12_4_;
  auVar75._16_4_ = auVar73._16_4_ * 0.0;
  auVar75._20_4_ = auVar73._20_4_ * 0.0;
  auVar75._24_4_ = auVar73._24_4_ * 0.0;
  auVar75._28_4_ = auVar73._28_4_;
  auVar73 = vcvtdq2ps_avx(auVar71);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar53));
  auVar82._0_4_ = auVar55._0_4_ * auVar73._0_4_;
  auVar82._4_4_ = auVar55._4_4_ * auVar73._4_4_;
  auVar82._8_4_ = auVar55._8_4_ * auVar73._8_4_;
  auVar82._12_4_ = auVar55._12_4_ * auVar73._12_4_;
  auVar82._16_4_ = auVar73._16_4_ * 0.0;
  auVar82._20_4_ = auVar73._20_4_ * 0.0;
  auVar82._24_4_ = auVar73._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 + uVar35 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar52));
  auVar76._4_4_ = auVar73._4_4_ * auVar4._4_4_;
  auVar76._0_4_ = auVar73._0_4_ * auVar4._0_4_;
  auVar76._8_4_ = auVar73._8_4_ * auVar4._8_4_;
  auVar76._12_4_ = auVar73._12_4_ * auVar4._12_4_;
  auVar76._16_4_ = auVar73._16_4_ * 0.0;
  auVar76._20_4_ = auVar73._20_4_ * 0.0;
  auVar76._24_4_ = auVar73._24_4_ * 0.0;
  auVar76._28_4_ = auVar73._28_4_;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x17 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar52));
  auVar81._0_4_ = auVar4._0_4_ * auVar73._0_4_;
  auVar81._4_4_ = auVar4._4_4_ * auVar73._4_4_;
  auVar81._8_4_ = auVar4._8_4_ * auVar73._8_4_;
  auVar81._12_4_ = auVar4._12_4_ * auVar73._12_4_;
  auVar81._16_4_ = auVar73._16_4_ * 0.0;
  auVar81._20_4_ = auVar73._20_4_ * 0.0;
  auVar81._24_4_ = auVar73._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar73 = vpminsd_avx2(auVar74,auVar83);
  auVar71 = vpminsd_avx2(auVar75,auVar82);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71 = vpminsd_avx2(auVar76,auVar81);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar84._4_4_ = uVar111;
  auVar84._0_4_ = uVar111;
  auVar84._8_4_ = uVar111;
  auVar84._12_4_ = uVar111;
  auVar84._16_4_ = uVar111;
  auVar84._20_4_ = uVar111;
  auVar84._24_4_ = uVar111;
  auVar84._28_4_ = uVar111;
  auVar71 = vmaxps_avx512vl(auVar71,auVar84);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  auVar71._16_4_ = 0x3f7ffffa;
  auVar71._20_4_ = 0x3f7ffffa;
  auVar71._24_4_ = 0x3f7ffffa;
  auVar71._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar73,auVar71);
  auVar73 = vpmaxsd_avx2(auVar74,auVar83);
  auVar71 = vpmaxsd_avx2(auVar75,auVar82);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar71 = vpmaxsd_avx2(auVar76,auVar81);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar85._4_4_ = uVar111;
  auVar85._0_4_ = uVar111;
  auVar85._8_4_ = uVar111;
  auVar85._12_4_ = uVar111;
  auVar85._16_4_ = uVar111;
  auVar85._20_4_ = uVar111;
  auVar85._24_4_ = uVar111;
  auVar85._28_4_ = uVar111;
  auVar71 = vminps_avx512vl(auVar71,auVar85);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar86._16_4_ = 0x3f800003;
  auVar86._20_4_ = 0x3f800003;
  auVar86._24_4_ = 0x3f800003;
  auVar86._28_4_ = 0x3f800003;
  auVar73 = vmulps_avx512vl(auVar73,auVar86);
  uVar14 = vpcmpgtd_avx512vl(auVar72,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_78,auVar73,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return false;
  }
  uVar38 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar235 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar236 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar43);
  auVar244 = ZEXT464(0x3f800000);
  auVar43 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar243 = ZEXT1664(auVar43);
  local_360 = context;
LAB_01d35413:
  pRVar27 = local_360;
  lVar32 = 0;
  for (uVar30 = uVar38; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar37 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar37].ptr;
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar32 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var12 + uVar30 * (long)pvVar11);
  auVar55 = *(undefined1 (*) [16])(_Var12 + (uVar30 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar30 + 2) * (long)pvVar11);
  auVar54 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar30 + 3));
  lVar32 = *(long *)&pGVar9[1].time_range.upper;
  auVar53 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * uVar30);
  auVar52 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar30 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar30 + 2));
  uVar38 = uVar38 - 1 & uVar38;
  auVar51 = *(undefined1 (*) [16])(lVar32 + (long)p_Var10 * (uVar30 + 3));
  if (uVar38 != 0) {
    uVar35 = uVar38 - 1 & uVar38;
    for (uVar30 = uVar38; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar114 = auVar235._0_16_;
  auVar44 = vmulps_avx512vl(auVar51,auVar114);
  auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar44);
  auVar45._0_4_ = auVar52._0_4_ + auVar46._0_4_;
  auVar45._4_4_ = auVar52._4_4_ + auVar46._4_4_;
  auVar45._8_4_ = auVar52._8_4_ + auVar46._8_4_;
  auVar45._12_4_ = auVar52._12_4_ + auVar46._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar114);
  auVar112 = ZEXT816(0) << 0x40;
  auVar49._0_4_ = auVar51._0_4_ * 0.0;
  auVar49._4_4_ = auVar51._4_4_ * 0.0;
  auVar49._8_4_ = auVar51._8_4_ * 0.0;
  auVar49._12_4_ = auVar51._12_4_ * 0.0;
  auVar56 = auVar236._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar49,auVar5,auVar56);
  auVar46 = vfmadd231ps_fma(auVar46,auVar52,auVar112);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar53,auVar56);
  auVar48 = vmulps_avx512vl(auVar54,auVar114);
  auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar48);
  auVar222._0_4_ = auVar46._0_4_ + auVar55._0_4_;
  auVar222._4_4_ = auVar46._4_4_ + auVar55._4_4_;
  auVar222._8_4_ = auVar46._8_4_ + auVar55._8_4_;
  auVar222._12_4_ = auVar46._12_4_ + auVar55._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar222,auVar43,auVar114);
  auVar226._0_4_ = auVar54._0_4_ * 0.0;
  auVar226._4_4_ = auVar54._4_4_ * 0.0;
  auVar226._8_4_ = auVar54._8_4_ * 0.0;
  auVar226._12_4_ = auVar54._12_4_ * 0.0;
  auVar46 = vfmadd231ps_avx512vl(auVar226,auVar4,auVar56);
  auVar46 = vfmadd231ps_fma(auVar46,auVar55,auVar112);
  auVar50 = vfnmadd231ps_avx512vl(auVar46,auVar43,auVar56);
  auVar59._0_4_ = auVar5._0_4_ + auVar44._0_4_;
  auVar59._4_4_ = auVar5._4_4_ + auVar44._4_4_;
  auVar59._8_4_ = auVar5._8_4_ + auVar44._8_4_;
  auVar59._12_4_ = auVar5._12_4_ + auVar44._12_4_;
  auVar46 = vfmadd231ps_fma(auVar59,auVar52,auVar112);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar114);
  auVar51 = vmulps_avx512vl(auVar51,auVar56);
  auVar5 = vfmadd231ps_fma(auVar51,auVar112,auVar5);
  auVar52 = vfnmadd231ps_avx512vl(auVar5,auVar56,auVar52);
  auVar5 = vfmadd231ps_fma(auVar52,auVar112,auVar53);
  auVar174._0_4_ = auVar48._0_4_ + auVar4._0_4_;
  auVar174._4_4_ = auVar48._4_4_ + auVar4._4_4_;
  auVar174._8_4_ = auVar48._8_4_ + auVar4._8_4_;
  auVar174._12_4_ = auVar48._12_4_ + auVar4._12_4_;
  auVar53 = vfmadd231ps_fma(auVar174,auVar55,auVar112);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar43,auVar114);
  auVar54 = vmulps_avx512vl(auVar54,auVar56);
  auVar4 = vfmadd231ps_fma(auVar54,auVar112,auVar4);
  auVar55 = vfnmadd231ps_avx512vl(auVar4,auVar56,auVar55);
  auVar52 = vfmadd231ps_fma(auVar55,auVar112,auVar43);
  auVar43 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar55 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar107 = auVar47._0_4_;
  auVar58._0_4_ = fVar107 * auVar55._0_4_;
  fVar108 = auVar47._4_4_;
  auVar58._4_4_ = fVar108 * auVar55._4_4_;
  fVar109 = auVar47._8_4_;
  auVar58._8_4_ = fVar109 * auVar55._8_4_;
  fVar110 = auVar47._12_4_;
  auVar58._12_4_ = fVar110 * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar58,auVar43,auVar49);
  auVar4 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar65._0_4_ = fVar107 * auVar55._0_4_;
  auVar65._4_4_ = fVar108 * auVar55._4_4_;
  auVar65._8_4_ = fVar109 * auVar55._8_4_;
  auVar65._12_4_ = fVar110 * auVar55._12_4_;
  auVar43 = vfmsub231ps_fma(auVar65,auVar43,auVar50);
  auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar55 = vshufps_avx(auVar53,auVar53,0xc9);
  fVar120 = auVar5._0_4_;
  auVar134._0_4_ = fVar120 * auVar55._0_4_;
  fVar131 = auVar5._4_4_;
  auVar134._4_4_ = fVar131 * auVar55._4_4_;
  fVar132 = auVar5._8_4_;
  auVar134._8_4_ = fVar132 * auVar55._8_4_;
  fVar133 = auVar5._12_4_;
  auVar134._12_4_ = fVar133 * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar134,auVar43,auVar53);
  auVar53 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar175._0_4_ = auVar55._0_4_ * fVar120;
  auVar175._4_4_ = auVar55._4_4_ * fVar131;
  auVar175._8_4_ = auVar55._8_4_ * fVar132;
  auVar175._12_4_ = auVar55._12_4_ * fVar133;
  auVar43 = vfmsub231ps_fma(auVar175,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar102 = auVar43._0_4_;
  auVar176._4_12_ = ZEXT812(0) << 0x20;
  auVar176._0_4_ = fVar102;
  auVar55 = vrsqrt14ss_avx512f(auVar112,auVar176);
  auVar51 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar209 = auVar55._0_4_;
  fVar209 = auVar51._0_4_ + auVar44._0_4_ * fVar209 * fVar209 * fVar209;
  fVar210 = fVar209 * auVar4._0_4_;
  fVar219 = fVar209 * auVar4._4_4_;
  fVar220 = fVar209 * auVar4._8_4_;
  fVar221 = fVar209 * auVar4._12_4_;
  auVar55 = vdpps_avx(auVar4,auVar54,0x7f);
  auVar187._0_4_ = auVar54._0_4_ * fVar102;
  auVar187._4_4_ = auVar54._4_4_ * fVar102;
  auVar187._8_4_ = auVar54._8_4_ * fVar102;
  auVar187._12_4_ = auVar54._12_4_ * fVar102;
  fVar102 = auVar55._0_4_;
  auVar153._0_4_ = fVar102 * auVar4._0_4_;
  auVar153._4_4_ = fVar102 * auVar4._4_4_;
  auVar153._8_4_ = fVar102 * auVar4._8_4_;
  auVar153._12_4_ = fVar102 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar187,auVar153);
  auVar55 = vrcp14ss_avx512f(auVar112,auVar176);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  fVar205 = auVar55._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar53,auVar53,0x7f);
  fVar207 = auVar43._0_4_;
  auVar165._4_12_ = ZEXT812(0) << 0x20;
  auVar165._0_4_ = fVar207;
  auVar55 = vrsqrt14ss_avx512f(auVar112,auVar165);
  auVar54 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar102 = auVar55._0_4_;
  fVar102 = auVar54._0_4_ + auVar51._0_4_ * fVar102 * fVar102 * fVar102;
  fVar194 = fVar102 * auVar53._0_4_;
  fVar204 = fVar102 * auVar53._4_4_;
  fVar206 = fVar102 * auVar53._8_4_;
  fVar208 = fVar102 * auVar53._12_4_;
  auVar55 = vdpps_avx(auVar53,auVar52,0x7f);
  auVar66._0_4_ = fVar207 * auVar52._0_4_;
  auVar66._4_4_ = fVar207 * auVar52._4_4_;
  auVar66._8_4_ = fVar207 * auVar52._8_4_;
  auVar66._12_4_ = fVar207 * auVar52._12_4_;
  fVar207 = auVar55._0_4_;
  auVar57._0_4_ = fVar207 * auVar53._0_4_;
  auVar57._4_4_ = fVar207 * auVar53._4_4_;
  auVar57._8_4_ = fVar207 * auVar53._8_4_;
  auVar57._12_4_ = fVar207 * auVar53._12_4_;
  auVar54 = vsubps_avx(auVar66,auVar57);
  auVar55 = vrcp14ss_avx512f(auVar112,auVar165);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  fVar207 = auVar43._0_4_ * auVar55._0_4_;
  auVar43 = vshufps_avx(auVar45,auVar45,0xff);
  auVar166._0_4_ = fVar210 * auVar43._0_4_;
  auVar166._4_4_ = fVar219 * auVar43._4_4_;
  auVar166._8_4_ = fVar220 * auVar43._8_4_;
  auVar166._12_4_ = fVar221 * auVar43._12_4_;
  local_1f8 = vsubps_avx(auVar45,auVar166);
  auVar55 = vshufps_avx(auVar47,auVar47,0xff);
  auVar144._0_4_ = auVar55._0_4_ * fVar210 + auVar43._0_4_ * fVar209 * fVar205 * auVar4._0_4_;
  auVar144._4_4_ = auVar55._4_4_ * fVar219 + auVar43._4_4_ * fVar209 * fVar205 * auVar4._4_4_;
  auVar144._8_4_ = auVar55._8_4_ * fVar220 + auVar43._8_4_ * fVar209 * fVar205 * auVar4._8_4_;
  auVar144._12_4_ = auVar55._12_4_ * fVar221 + auVar43._12_4_ * fVar209 * fVar205 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar47,auVar144);
  local_208._0_4_ = auVar166._0_4_ + auVar45._0_4_;
  local_208._4_4_ = auVar166._4_4_ + auVar45._4_4_;
  fStack_200 = auVar166._8_4_ + auVar45._8_4_;
  fStack_1fc = auVar166._12_4_ + auVar45._12_4_;
  auVar43 = vshufps_avx(auVar46,auVar46,0xff);
  auVar145._0_4_ = fVar194 * auVar43._0_4_;
  auVar145._4_4_ = fVar204 * auVar43._4_4_;
  auVar145._8_4_ = fVar206 * auVar43._8_4_;
  auVar145._12_4_ = fVar208 * auVar43._12_4_;
  local_218 = vsubps_avx(auVar46,auVar145);
  auVar55 = vshufps_avx(auVar5,auVar5,0xff);
  auVar56._0_4_ = auVar55._0_4_ * fVar194 + auVar43._0_4_ * fVar102 * auVar54._0_4_ * fVar207;
  auVar56._4_4_ = auVar55._4_4_ * fVar204 + auVar43._4_4_ * fVar102 * auVar54._4_4_ * fVar207;
  auVar56._8_4_ = auVar55._8_4_ * fVar206 + auVar43._8_4_ * fVar102 * auVar54._8_4_ * fVar207;
  auVar56._12_4_ = auVar55._12_4_ * fVar208 + auVar43._12_4_ * fVar102 * auVar54._12_4_ * fVar207;
  auVar43 = vsubps_avx(auVar5,auVar56);
  _local_228 = vaddps_avx512vl(auVar46,auVar145);
  auVar60._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar4._12_4_ * 0.33333334;
  local_238 = vaddps_avx512vl(local_1f8,auVar60);
  auVar63._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar43._12_4_ * 0.33333334;
  local_248 = vsubps_avx512vl(local_218,auVar63);
  auVar44._0_4_ = (fVar107 + auVar144._0_4_) * 0.33333334;
  auVar44._4_4_ = (fVar108 + auVar144._4_4_) * 0.33333334;
  auVar44._8_4_ = (fVar109 + auVar144._8_4_) * 0.33333334;
  auVar44._12_4_ = (fVar110 + auVar144._12_4_) * 0.33333334;
  _local_258 = vaddps_avx512vl(_local_208,auVar44);
  auVar47._0_4_ = (fVar120 + auVar56._0_4_) * 0.33333334;
  auVar47._4_4_ = (fVar131 + auVar56._4_4_) * 0.33333334;
  auVar47._8_4_ = (fVar132 + auVar56._8_4_) * 0.33333334;
  auVar47._12_4_ = (fVar133 + auVar56._12_4_) * 0.33333334;
  _local_268 = vsubps_avx512vl(_local_228,auVar47);
  local_178 = vsubps_avx(local_1f8,auVar6);
  uVar111 = local_178._0_4_;
  auVar64._4_4_ = uVar111;
  auVar64._0_4_ = uVar111;
  auVar64._8_4_ = uVar111;
  auVar64._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_178,local_178,0x55);
  auVar55 = vshufps_avx(local_178,local_178,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar209 = pre->ray_space[k].vz.field_0.m128[0];
  fVar102 = pre->ray_space[k].vz.field_0.m128[1];
  fVar205 = pre->ray_space[k].vz.field_0.m128[2];
  fVar207 = pre->ray_space[k].vz.field_0.m128[3];
  auVar48._0_4_ = fVar209 * auVar55._0_4_;
  auVar48._4_4_ = fVar102 * auVar55._4_4_;
  auVar48._8_4_ = fVar205 * auVar55._8_4_;
  auVar48._12_4_ = fVar207 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar3,auVar43);
  auVar51 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar64);
  local_188 = vsubps_avx512vl(local_238,auVar6);
  uVar111 = local_188._0_4_;
  auVar61._4_4_ = uVar111;
  auVar61._0_4_ = uVar111;
  auVar61._8_4_ = uVar111;
  auVar61._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_188,local_188,0x55);
  auVar55 = vshufps_avx(local_188,local_188,0xaa);
  auVar67._0_4_ = fVar209 * auVar55._0_4_;
  auVar67._4_4_ = fVar102 * auVar55._4_4_;
  auVar67._8_4_ = fVar205 * auVar55._8_4_;
  auVar67._12_4_ = fVar207 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar61);
  local_198 = vsubps_avx512vl(local_248,auVar6);
  uVar111 = local_198._0_4_;
  auVar154._4_4_ = uVar111;
  auVar154._0_4_ = uVar111;
  auVar154._8_4_ = uVar111;
  auVar154._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_198,local_198,0x55);
  auVar55 = vshufps_avx(local_198,local_198,0xaa);
  auVar62._0_4_ = fVar209 * auVar55._0_4_;
  auVar62._4_4_ = fVar102 * auVar55._4_4_;
  auVar62._8_4_ = fVar205 * auVar55._8_4_;
  auVar62._12_4_ = fVar207 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar43);
  auVar44 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar154);
  local_1a8 = vsubps_avx(local_218,auVar6);
  uVar111 = local_1a8._0_4_;
  auVar155._4_4_ = uVar111;
  auVar155._0_4_ = uVar111;
  auVar155._8_4_ = uVar111;
  auVar155._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar55 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar177._0_4_ = auVar55._0_4_ * fVar209;
  auVar177._4_4_ = auVar55._4_4_ * fVar102;
  auVar177._8_4_ = auVar55._8_4_ * fVar205;
  auVar177._12_4_ = auVar55._12_4_ * fVar207;
  auVar43 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar3,auVar43);
  auVar45 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar155);
  local_1b8 = vsubps_avx(_local_208,auVar6);
  uVar111 = local_1b8._0_4_;
  auVar156._4_4_ = uVar111;
  auVar156._0_4_ = uVar111;
  auVar156._8_4_ = uVar111;
  auVar156._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar55 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar188._0_4_ = auVar55._0_4_ * fVar209;
  auVar188._4_4_ = auVar55._4_4_ * fVar102;
  auVar188._8_4_ = auVar55._8_4_ * fVar205;
  auVar188._12_4_ = auVar55._12_4_ * fVar207;
  auVar43 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar3,auVar43);
  auVar47 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar156);
  local_1c8 = vsubps_avx512vl(_local_258,auVar6);
  uVar111 = local_1c8._0_4_;
  auVar157._4_4_ = uVar111;
  auVar157._0_4_ = uVar111;
  auVar157._8_4_ = uVar111;
  auVar157._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar55 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar195._0_4_ = auVar55._0_4_ * fVar209;
  auVar195._4_4_ = auVar55._4_4_ * fVar102;
  auVar195._8_4_ = auVar55._8_4_ * fVar205;
  auVar195._12_4_ = auVar55._12_4_ * fVar207;
  auVar43 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar3,auVar43);
  auVar48 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar157);
  local_1d8 = vsubps_avx512vl(_local_268,auVar6);
  uVar111 = local_1d8._0_4_;
  auVar158._4_4_ = uVar111;
  auVar158._0_4_ = uVar111;
  auVar158._8_4_ = uVar111;
  auVar158._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar55 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar211._0_4_ = auVar55._0_4_ * fVar209;
  auVar211._4_4_ = auVar55._4_4_ * fVar102;
  auVar211._8_4_ = auVar55._8_4_ * fVar205;
  auVar211._12_4_ = auVar55._12_4_ * fVar207;
  auVar43 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar3,auVar43);
  auVar49 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar158);
  local_1e8 = vsubps_avx512vl(_local_228,auVar6);
  uVar111 = local_1e8._0_4_;
  auVar50._4_4_ = uVar111;
  auVar50._0_4_ = uVar111;
  auVar50._8_4_ = uVar111;
  auVar50._12_4_ = uVar111;
  auVar43 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar55 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar146._0_4_ = auVar55._0_4_ * fVar209;
  auVar146._4_4_ = auVar55._4_4_ * fVar102;
  auVar146._8_4_ = auVar55._8_4_ * fVar205;
  auVar146._12_4_ = auVar55._12_4_ * fVar207;
  auVar43 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar3,auVar43);
  auVar6 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar50);
  auVar4 = vmovlhps_avx(auVar51,auVar47);
  auVar52 = vmovlhps_avx512f(auVar46,auVar48);
  auVar5 = vmovlhps_avx512f(auVar44,auVar49);
  _local_348 = vmovlhps_avx512f(auVar45,auVar6);
  auVar43 = vminps_avx512vl(auVar4,auVar52);
  auVar54 = vmaxps_avx512vl(auVar4,auVar52);
  auVar55 = vminps_avx512vl(auVar5,_local_348);
  auVar55 = vminps_avx(auVar43,auVar55);
  auVar43 = vmaxps_avx512vl(auVar5,_local_348);
  auVar43 = vmaxps_avx(auVar54,auVar43);
  auVar54 = vshufpd_avx(auVar55,auVar55,3);
  auVar53 = vshufpd_avx(auVar43,auVar43,3);
  auVar55 = vminps_avx(auVar55,auVar54);
  auVar43 = vmaxps_avx(auVar43,auVar53);
  auVar55 = vandps_avx512vl(auVar55,auVar237._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar237._0_16_);
  auVar43 = vmaxps_avx(auVar55,auVar43);
  auVar55 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar55,auVar43);
  auVar159._8_8_ = auVar51._0_8_;
  auVar159._0_8_ = auVar51._0_8_;
  auVar55 = vmovddup_avx512vl(auVar46);
  auVar54 = vmovddup_avx512vl(auVar44);
  auVar112._8_8_ = auVar45._0_8_;
  auVar112._0_8_ = auVar45._0_8_;
  local_358 = ZEXT416((uint)(auVar43._0_4_ * 9.536743e-07));
  local_148 = vbroadcastss_avx512vl(local_358);
  auVar43 = vxorps_avx512vl(local_148._0_16_,auVar114);
  auVar73 = vbroadcastss_avx512vl(auVar43);
  local_278 = vpbroadcastd_avx512vl();
  bVar36 = false;
  uVar30 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x30);
  auVar53 = vsubps_avx512vl(auVar52,auVar4);
  local_158 = vsubps_avx512vl(auVar5,auVar52);
  local_168 = vsubps_avx512vl(_local_348,auVar5);
  local_288 = vsubps_avx(_local_208,local_1f8);
  local_298 = vsubps_avx512vl(_local_258,local_238);
  local_2a8 = vsubps_avx512vl(_local_268,local_248);
  _local_2b8 = vsubps_avx512vl(_local_228,local_218);
  local_2c8 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar46 = auVar43;
LAB_01d35b5d:
  do {
    auVar51 = vshufps_avx(auVar46,auVar46,0x50);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar45 = vsubps_avx512vl(auVar74._0_16_,auVar51);
    fVar209 = auVar51._0_4_;
    fVar107 = auVar47._0_4_;
    auVar127._0_4_ = fVar107 * fVar209;
    fVar102 = auVar51._4_4_;
    fVar108 = auVar47._4_4_;
    auVar127._4_4_ = fVar108 * fVar102;
    fVar205 = auVar51._8_4_;
    auVar127._8_4_ = fVar107 * fVar205;
    fVar207 = auVar51._12_4_;
    auVar127._12_4_ = fVar108 * fVar207;
    fVar109 = auVar48._0_4_;
    auVar135._0_4_ = fVar109 * fVar209;
    fVar110 = auVar48._4_4_;
    auVar135._4_4_ = fVar110 * fVar102;
    auVar135._8_4_ = fVar109 * fVar205;
    auVar135._12_4_ = fVar110 * fVar207;
    fVar120 = auVar49._0_4_;
    auVar147._0_4_ = fVar120 * fVar209;
    fVar131 = auVar49._4_4_;
    auVar147._4_4_ = fVar131 * fVar102;
    auVar147._8_4_ = fVar120 * fVar205;
    auVar147._12_4_ = fVar131 * fVar207;
    fVar132 = auVar6._0_4_;
    auVar114._0_4_ = fVar132 * fVar209;
    fVar133 = auVar6._4_4_;
    auVar114._4_4_ = fVar133 * fVar102;
    auVar114._8_4_ = fVar132 * fVar205;
    auVar114._12_4_ = fVar133 * fVar207;
    auVar44 = vfmadd231ps_fma(auVar127,auVar45,auVar159);
    auVar50 = vfmadd231ps_avx512vl(auVar135,auVar45,auVar55);
    auVar56 = vfmadd231ps_avx512vl(auVar147,auVar45,auVar54);
    auVar45 = vfmadd231ps_fma(auVar114,auVar112,auVar45);
    auVar51 = vmovshdup_avx(auVar43);
    fVar102 = auVar43._0_4_;
    fVar209 = (auVar51._0_4_ - fVar102) * 0.04761905;
    auVar173._4_4_ = fVar102;
    auVar173._0_4_ = fVar102;
    auVar173._8_4_ = fVar102;
    auVar173._12_4_ = fVar102;
    auVar173._16_4_ = fVar102;
    auVar173._20_4_ = fVar102;
    auVar173._24_4_ = fVar102;
    auVar173._28_4_ = fVar102;
    auVar125._0_8_ = auVar51._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar125._16_8_ = auVar125._0_8_;
    auVar125._24_8_ = auVar125._0_8_;
    auVar71 = vsubps_avx(auVar125,auVar173);
    uVar111 = auVar44._0_4_;
    auVar126._4_4_ = uVar111;
    auVar126._0_4_ = uVar111;
    auVar126._8_4_ = uVar111;
    auVar126._12_4_ = uVar111;
    auVar126._16_4_ = uVar111;
    auVar126._20_4_ = uVar111;
    auVar126._24_4_ = uVar111;
    auVar126._28_4_ = uVar111;
    auVar191._8_4_ = 1;
    auVar191._0_8_ = 0x100000001;
    auVar191._12_4_ = 1;
    auVar191._16_4_ = 1;
    auVar191._20_4_ = 1;
    auVar191._24_4_ = 1;
    auVar191._28_4_ = 1;
    auVar85 = ZEXT1632(auVar44);
    auVar84 = vpermps_avx2(auVar191,auVar85);
    auVar75 = vbroadcastss_avx512vl(auVar50);
    auVar86 = ZEXT1632(auVar50);
    auVar76 = vpermps_avx512vl(auVar191,auVar86);
    auVar77 = vbroadcastss_avx512vl(auVar56);
    auVar72 = ZEXT1632(auVar56);
    auVar70 = vpermps_avx512vl(auVar191,auVar72);
    auVar78 = vbroadcastss_avx512vl(auVar45);
    auVar82 = ZEXT1632(auVar45);
    auVar79 = vpermps_avx512vl(auVar191,auVar82);
    auVar192._4_4_ = fVar209;
    auVar192._0_4_ = fVar209;
    auVar192._8_4_ = fVar209;
    auVar192._12_4_ = fVar209;
    auVar192._16_4_ = fVar209;
    auVar192._20_4_ = fVar209;
    auVar192._24_4_ = fVar209;
    auVar192._28_4_ = fVar209;
    auVar229._8_4_ = 2;
    auVar229._0_8_ = 0x200000002;
    auVar229._12_4_ = 2;
    auVar229._16_4_ = 2;
    auVar229._20_4_ = 2;
    auVar229._24_4_ = 2;
    auVar229._28_4_ = 2;
    auVar68 = vpermps_avx512vl(auVar229,auVar85);
    auVar164._8_4_ = 3;
    auVar164._0_8_ = 0x300000003;
    auVar164._12_4_ = 3;
    auVar164._16_4_ = 3;
    auVar164._20_4_ = 3;
    auVar164._24_4_ = 3;
    auVar164._28_4_ = 3;
    auVar69 = vpermps_avx512vl(auVar164,auVar85);
    auVar80 = vpermps_avx512vl(auVar229,auVar86);
    auVar85 = vpermps_avx2(auVar164,auVar86);
    auVar86 = vpermps_avx2(auVar229,auVar72);
    auVar72 = vpermps_avx2(auVar164,auVar72);
    auVar81 = vpermps_avx512vl(auVar229,auVar82);
    auVar82 = vpermps_avx512vl(auVar164,auVar82);
    auVar51 = vfmadd132ps_fma(auVar71,auVar173,_DAT_01faff20);
    auVar74 = vsubps_avx512vl(auVar74,ZEXT1632(auVar51));
    auVar71 = vmulps_avx512vl(auVar75,ZEXT1632(auVar51));
    auVar87 = ZEXT1632(auVar51);
    auVar83 = vmulps_avx512vl(auVar76,auVar87);
    auVar44 = vfmadd231ps_fma(auVar71,auVar74,auVar126);
    auVar45 = vfmadd231ps_fma(auVar83,auVar74,auVar84);
    auVar71 = vmulps_avx512vl(auVar77,auVar87);
    auVar83 = vmulps_avx512vl(auVar70,auVar87);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar74,auVar75);
    auVar75 = vfmadd231ps_avx512vl(auVar83,auVar74,auVar76);
    auVar76 = vmulps_avx512vl(auVar78,auVar87);
    auVar83 = ZEXT1632(auVar51);
    auVar79 = vmulps_avx512vl(auVar79,auVar83);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar70);
    fVar205 = auVar51._0_4_;
    fVar207 = auVar51._4_4_;
    auVar21._4_4_ = fVar207 * auVar71._4_4_;
    auVar21._0_4_ = fVar205 * auVar71._0_4_;
    fVar194 = auVar51._8_4_;
    auVar21._8_4_ = fVar194 * auVar71._8_4_;
    fVar204 = auVar51._12_4_;
    auVar21._12_4_ = fVar204 * auVar71._12_4_;
    auVar21._16_4_ = auVar71._16_4_ * 0.0;
    auVar21._20_4_ = auVar71._20_4_ * 0.0;
    auVar21._24_4_ = auVar71._24_4_ * 0.0;
    auVar21._28_4_ = fVar102;
    auVar22._4_4_ = fVar207 * auVar75._4_4_;
    auVar22._0_4_ = fVar205 * auVar75._0_4_;
    auVar22._8_4_ = fVar194 * auVar75._8_4_;
    auVar22._12_4_ = fVar204 * auVar75._12_4_;
    auVar22._16_4_ = auVar75._16_4_ * 0.0;
    auVar22._20_4_ = auVar75._20_4_ * 0.0;
    auVar22._24_4_ = auVar75._24_4_ * 0.0;
    auVar22._28_4_ = auVar84._28_4_;
    auVar44 = vfmadd231ps_fma(auVar21,auVar74,ZEXT1632(auVar44));
    auVar45 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar45));
    auVar118._0_4_ = fVar205 * auVar76._0_4_;
    auVar118._4_4_ = fVar207 * auVar76._4_4_;
    auVar118._8_4_ = fVar194 * auVar76._8_4_;
    auVar118._12_4_ = fVar204 * auVar76._12_4_;
    auVar118._16_4_ = auVar76._16_4_ * 0.0;
    auVar118._20_4_ = auVar76._20_4_ * 0.0;
    auVar118._24_4_ = auVar76._24_4_ * 0.0;
    auVar118._28_4_ = 0;
    auVar23._4_4_ = fVar207 * auVar77._4_4_;
    auVar23._0_4_ = fVar205 * auVar77._0_4_;
    auVar23._8_4_ = fVar194 * auVar77._8_4_;
    auVar23._12_4_ = fVar204 * auVar77._12_4_;
    auVar23._16_4_ = auVar77._16_4_ * 0.0;
    auVar23._20_4_ = auVar77._20_4_ * 0.0;
    auVar23._24_4_ = auVar77._24_4_ * 0.0;
    auVar23._28_4_ = auVar76._28_4_;
    auVar50 = vfmadd231ps_fma(auVar118,auVar74,auVar71);
    auVar56 = vfmadd231ps_fma(auVar23,auVar74,auVar75);
    auVar24._28_4_ = auVar75._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar204 * auVar56._12_4_,
                            CONCAT48(fVar194 * auVar56._8_4_,
                                     CONCAT44(fVar207 * auVar56._4_4_,fVar205 * auVar56._0_4_))));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar204 * auVar50._12_4_,
                                                 CONCAT48(fVar194 * auVar50._8_4_,
                                                          CONCAT44(fVar207 * auVar50._4_4_,
                                                                   fVar205 * auVar50._0_4_)))),
                              auVar74,ZEXT1632(auVar44));
    auVar67 = vfmadd231ps_fma(auVar24,auVar74,ZEXT1632(auVar45));
    auVar71 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar44));
    auVar84 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar45));
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar71 = vmulps_avx512vl(auVar71,auVar75);
    auVar84 = vmulps_avx512vl(auVar84,auVar75);
    auVar186._0_4_ = fVar209 * auVar71._0_4_;
    auVar186._4_4_ = fVar209 * auVar71._4_4_;
    auVar186._8_4_ = fVar209 * auVar71._8_4_;
    auVar186._12_4_ = fVar209 * auVar71._12_4_;
    auVar186._16_4_ = fVar209 * auVar71._16_4_;
    auVar186._20_4_ = fVar209 * auVar71._20_4_;
    auVar186._24_4_ = fVar209 * auVar71._24_4_;
    auVar186._28_4_ = 0;
    auVar71 = vmulps_avx512vl(auVar192,auVar84);
    auVar45 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01feed00,ZEXT1632(auVar45));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01feed00,ZEXT1632(auVar45));
    auVar119._0_4_ = auVar186._0_4_ + auVar64._0_4_;
    auVar119._4_4_ = auVar186._4_4_ + auVar64._4_4_;
    auVar119._8_4_ = auVar186._8_4_ + auVar64._8_4_;
    auVar119._12_4_ = auVar186._12_4_ + auVar64._12_4_;
    auVar119._16_4_ = auVar186._16_4_ + 0.0;
    auVar119._20_4_ = auVar186._20_4_ + 0.0;
    auVar119._24_4_ = auVar186._24_4_ + 0.0;
    auVar119._28_4_ = 0;
    auVar87 = ZEXT1632(auVar45);
    auVar84 = vpermt2ps_avx512vl(auVar186,_DAT_01feed00,auVar87);
    auVar70 = vaddps_avx512vl(ZEXT1632(auVar67),auVar71);
    auVar78 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,auVar87);
    auVar71 = vsubps_avx(auVar76,auVar84);
    auVar78 = vsubps_avx512vl(auVar77,auVar78);
    auVar84 = vmulps_avx512vl(auVar80,auVar83);
    auVar79 = vmulps_avx512vl(auVar85,auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar74,auVar68);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar69);
    auVar68 = vmulps_avx512vl(auVar86,auVar83);
    auVar69 = vmulps_avx512vl(auVar72,auVar83);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar80);
    auVar85 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar85);
    auVar69 = vmulps_avx512vl(auVar81,auVar83);
    auVar80 = vmulps_avx512vl(auVar82,auVar83);
    auVar44 = vfmadd231ps_fma(auVar69,auVar74,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar72);
    auVar69 = vmulps_avx512vl(auVar83,auVar68);
    auVar81 = ZEXT1632(auVar51);
    auVar80 = vmulps_avx512vl(auVar81,auVar85);
    auVar84 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar84);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar79);
    auVar86 = vmulps_avx512vl(auVar81,auVar86);
    auVar68 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar204 * auVar44._12_4_,
                                            CONCAT48(fVar194 * auVar44._8_4_,
                                                     CONCAT44(fVar207 * auVar44._4_4_,
                                                              fVar205 * auVar44._0_4_)))),auVar74,
                         auVar68);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar74,auVar85);
    auVar25._4_4_ = fVar207 * auVar68._4_4_;
    auVar25._0_4_ = fVar205 * auVar68._0_4_;
    auVar25._8_4_ = fVar194 * auVar68._8_4_;
    auVar25._12_4_ = fVar204 * auVar68._12_4_;
    auVar25._16_4_ = auVar68._16_4_ * 0.0;
    auVar25._20_4_ = auVar68._20_4_ * 0.0;
    auVar25._24_4_ = auVar68._24_4_ * 0.0;
    auVar25._28_4_ = auVar72._28_4_;
    auVar86 = vmulps_avx512vl(auVar81,auVar85);
    auVar72 = vfmadd231ps_avx512vl(auVar25,auVar74,auVar84);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar74);
    auVar84 = vsubps_avx512vl(auVar68,auVar84);
    auVar85 = vsubps_avx512vl(auVar85,auVar79);
    auVar84 = vmulps_avx512vl(auVar84,auVar75);
    auVar85 = vmulps_avx512vl(auVar85,auVar75);
    fVar102 = fVar209 * auVar84._0_4_;
    fVar205 = fVar209 * auVar84._4_4_;
    auVar26._4_4_ = fVar205;
    auVar26._0_4_ = fVar102;
    fVar207 = fVar209 * auVar84._8_4_;
    auVar26._8_4_ = fVar207;
    fVar194 = fVar209 * auVar84._12_4_;
    auVar26._12_4_ = fVar194;
    fVar204 = fVar209 * auVar84._16_4_;
    auVar26._16_4_ = fVar204;
    fVar206 = fVar209 * auVar84._20_4_;
    auVar26._20_4_ = fVar206;
    fVar209 = fVar209 * auVar84._24_4_;
    auVar26._24_4_ = fVar209;
    auVar26._28_4_ = auVar84._28_4_;
    auVar85 = vmulps_avx512vl(auVar192,auVar85);
    auVar74 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,auVar87);
    auVar75 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar87);
    auVar193._0_4_ = auVar72._0_4_ + fVar102;
    auVar193._4_4_ = auVar72._4_4_ + fVar205;
    auVar193._8_4_ = auVar72._8_4_ + fVar207;
    auVar193._12_4_ = auVar72._12_4_ + fVar194;
    auVar193._16_4_ = auVar72._16_4_ + fVar204;
    auVar193._20_4_ = auVar72._20_4_ + fVar206;
    auVar193._24_4_ = auVar72._24_4_ + fVar209;
    auVar193._28_4_ = auVar72._28_4_ + auVar84._28_4_;
    auVar84 = vpermt2ps_avx512vl(auVar26,_DAT_01feed00,ZEXT1632(auVar45));
    auVar79 = vaddps_avx512vl(auVar86,auVar85);
    auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,ZEXT1632(auVar45));
    auVar84 = vsubps_avx(auVar74,auVar84);
    auVar85 = vsubps_avx512vl(auVar75,auVar85);
    auVar129 = ZEXT1632(auVar64);
    auVar68 = vsubps_avx512vl(auVar72,auVar129);
    auVar141 = ZEXT1632(auVar67);
    auVar69 = vsubps_avx512vl(auVar86,auVar141);
    auVar80 = vsubps_avx512vl(auVar74,auVar76);
    auVar68 = vaddps_avx512vl(auVar68,auVar80);
    auVar80 = vsubps_avx512vl(auVar75,auVar77);
    auVar69 = vaddps_avx512vl(auVar69,auVar80);
    auVar80 = vmulps_avx512vl(auVar141,auVar68);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar129,auVar69);
    auVar81 = vmulps_avx512vl(auVar70,auVar68);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar119,auVar69);
    auVar82 = vmulps_avx512vl(auVar78,auVar68);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar71,auVar69);
    auVar83 = vmulps_avx512vl(auVar77,auVar68);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar76,auVar69);
    auVar87 = vmulps_avx512vl(auVar86,auVar68);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar72,auVar69);
    auVar88 = vmulps_avx512vl(auVar79,auVar68);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar193,auVar69);
    auVar89 = vmulps_avx512vl(auVar85,auVar68);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar84,auVar69);
    auVar68 = vmulps_avx512vl(auVar75,auVar68);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar74,auVar69);
    auVar69 = vminps_avx512vl(auVar80,auVar81);
    auVar80 = vmaxps_avx512vl(auVar80,auVar81);
    auVar81 = vminps_avx512vl(auVar82,auVar83);
    auVar69 = vminps_avx512vl(auVar69,auVar81);
    auVar81 = vmaxps_avx512vl(auVar82,auVar83);
    auVar80 = vmaxps_avx512vl(auVar80,auVar81);
    auVar81 = vminps_avx512vl(auVar87,auVar88);
    auVar82 = vmaxps_avx512vl(auVar87,auVar88);
    auVar83 = vminps_avx512vl(auVar89,auVar68);
    auVar81 = vminps_avx512vl(auVar81,auVar83);
    auVar69 = vminps_avx512vl(auVar69,auVar81);
    auVar68 = vmaxps_avx512vl(auVar89,auVar68);
    auVar68 = vmaxps_avx512vl(auVar82,auVar68);
    auVar68 = vmaxps_avx512vl(auVar80,auVar68);
    uVar13 = vcmpps_avx512vl(auVar69,local_148,2);
    uVar14 = vcmpps_avx512vl(auVar68,auVar73,5);
    bVar28 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    auVar242 = ZEXT3264(auVar73);
    if (bVar28 == 0) {
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar68 = vsubps_avx512vl(auVar76,auVar129);
      auVar69 = vsubps_avx512vl(auVar77,auVar141);
      auVar80 = vsubps_avx512vl(auVar74,auVar72);
      auVar68 = vaddps_avx512vl(auVar68,auVar80);
      auVar80 = vsubps_avx512vl(auVar75,auVar86);
      auVar69 = vaddps_avx512vl(auVar69,auVar80);
      auVar80 = vmulps_avx512vl(auVar141,auVar68);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar69,auVar129);
      auVar70 = vmulps_avx512vl(auVar70,auVar68);
      auVar70 = vfnmadd213ps_avx512vl(auVar119,auVar69,auVar70);
      auVar78 = vmulps_avx512vl(auVar78,auVar68);
      auVar78 = vfnmadd213ps_avx512vl(auVar71,auVar69,auVar78);
      auVar71 = vmulps_avx512vl(auVar77,auVar68);
      auVar76 = vfnmadd231ps_avx512vl(auVar71,auVar69,auVar76);
      auVar71 = vmulps_avx512vl(auVar86,auVar68);
      auVar72 = vfnmadd231ps_avx512vl(auVar71,auVar69,auVar72);
      auVar71 = vmulps_avx512vl(auVar79,auVar68);
      auVar77 = vfnmadd213ps_avx512vl(auVar193,auVar69,auVar71);
      auVar71 = vmulps_avx512vl(auVar85,auVar68);
      auVar79 = vfnmadd213ps_avx512vl(auVar84,auVar69,auVar71);
      auVar71 = vmulps_avx512vl(auVar75,auVar68);
      auVar74 = vfnmadd231ps_avx512vl(auVar71,auVar74,auVar69);
      auVar84 = vminps_avx(auVar80,auVar70);
      auVar71 = vmaxps_avx(auVar80,auVar70);
      auVar85 = vminps_avx(auVar78,auVar76);
      auVar85 = vminps_avx(auVar84,auVar85);
      auVar84 = vmaxps_avx(auVar78,auVar76);
      auVar71 = vmaxps_avx(auVar71,auVar84);
      auVar86 = vminps_avx(auVar72,auVar77);
      auVar84 = vmaxps_avx(auVar72,auVar77);
      auVar72 = vminps_avx(auVar79,auVar74);
      auVar86 = vminps_avx(auVar86,auVar72);
      auVar86 = vminps_avx(auVar85,auVar86);
      auVar85 = vmaxps_avx(auVar79,auVar74);
      auVar84 = vmaxps_avx(auVar84,auVar85);
      auVar71 = vmaxps_avx(auVar71,auVar84);
      uVar13 = vcmpps_avx512vl(auVar71,auVar73,5);
      uVar14 = vcmpps_avx512vl(auVar86,local_148,2);
      bVar28 = bVar28 & (byte)uVar13 & (byte)uVar14;
      if (bVar28 != 0) {
        auStack_338[uVar30] = (uint)bVar28;
        uVar13 = vmovlps_avx(auVar43);
        (&uStack_128)[uVar30] = uVar13;
        uVar35 = vmovlps_avx(auVar46);
        auStack_58[uVar30] = uVar35;
        uVar30 = (ulong)((int)uVar30 + 1);
      }
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar241 = ZEXT3264(_DAT_01feed20);
    auVar240 = ZEXT1664(auVar51);
    auVar239 = ZEXT1664(auVar45);
    auVar238 = ZEXT3264(auVar73);
    auVar237 = ZEXT1664(auVar44);
    auVar236 = ZEXT1664(auVar46);
    auVar235 = ZEXT1664(auVar43);
LAB_01d360f2:
    do {
      do {
        auVar73 = auVar242._0_32_;
        if ((int)uVar30 == 0) {
          if (bVar36 != false) {
            return bVar36;
          }
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar20._4_4_ = uVar111;
          auVar20._0_4_ = uVar111;
          auVar20._8_4_ = uVar111;
          auVar20._12_4_ = uVar111;
          auVar20._16_4_ = uVar111;
          auVar20._20_4_ = uVar111;
          auVar20._24_4_ = uVar111;
          auVar20._28_4_ = uVar111;
          uVar13 = vcmpps_avx512vl(local_78,auVar20,2);
          uVar37 = (uint)uVar38 & (uint)uVar13;
          uVar38 = (ulong)uVar37;
          context = pRVar27;
          if (uVar37 == 0) {
            return false;
          }
          goto LAB_01d35413;
        }
        uVar29 = (int)uVar30 - 1;
        uVar31 = (ulong)uVar29;
        uVar8 = auStack_338[uVar31];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auStack_58[uVar31];
        uVar35 = 0;
        for (uVar34 = (ulong)uVar8; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          uVar35 = uVar35 + 1;
        }
        uVar33 = uVar8 - 1 & uVar8;
        bVar41 = uVar33 == 0;
        auStack_338[uVar31] = uVar33;
        if (bVar41) {
          uVar30 = (ulong)uVar29;
        }
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar35;
        auVar43 = vpunpcklqdq_avx(auVar103,ZEXT416((int)uVar35 + 1));
        auVar43 = vcvtqq2ps_avx512vl(auVar43);
        auVar43 = vmulps_avx512vl(auVar43,auVar239._0_16_);
        uVar111 = *(undefined4 *)((long)&uStack_128 + uVar31 * 8 + 4);
        auVar15._4_4_ = uVar111;
        auVar15._0_4_ = uVar111;
        auVar15._8_4_ = uVar111;
        auVar15._12_4_ = uVar111;
        auVar51 = vmulps_avx512vl(auVar43,auVar15);
        auVar44 = auVar240._0_16_;
        auVar43 = vsubps_avx512vl(auVar44,auVar43);
        uVar111 = *(undefined4 *)(&uStack_128 + uVar31);
        auVar16._4_4_ = uVar111;
        auVar16._0_4_ = uVar111;
        auVar16._8_4_ = uVar111;
        auVar16._12_4_ = uVar111;
        auVar43 = vfmadd231ps_avx512vl(auVar51,auVar43,auVar16);
        auVar51 = vmovshdup_avx(auVar43);
        fVar209 = auVar51._0_4_ - auVar43._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        if (uVar8 == 0 || bVar41) goto LAB_01d35b5d;
        auVar51 = vshufps_avx(auVar46,auVar46,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar209));
        auVar56 = vsubps_avx512vl(auVar44,auVar51);
        fVar102 = auVar51._0_4_;
        auVar136._0_4_ = fVar102 * fVar107;
        fVar205 = auVar51._4_4_;
        auVar136._4_4_ = fVar205 * fVar108;
        fVar207 = auVar51._8_4_;
        auVar136._8_4_ = fVar207 * fVar107;
        fVar194 = auVar51._12_4_;
        auVar136._12_4_ = fVar194 * fVar108;
        auVar148._0_4_ = fVar102 * fVar109;
        auVar148._4_4_ = fVar205 * fVar110;
        auVar148._8_4_ = fVar207 * fVar109;
        auVar148._12_4_ = fVar194 * fVar110;
        auVar160._0_4_ = fVar120 * fVar102;
        auVar160._4_4_ = fVar131 * fVar205;
        auVar160._8_4_ = fVar120 * fVar207;
        auVar160._12_4_ = fVar131 * fVar194;
        auVar121._0_4_ = fVar132 * fVar102;
        auVar121._4_4_ = fVar133 * fVar205;
        auVar121._8_4_ = fVar132 * fVar207;
        auVar121._12_4_ = fVar133 * fVar194;
        auVar51 = vfmadd231ps_fma(auVar136,auVar56,auVar159);
        auVar45 = vfmadd231ps_fma(auVar148,auVar56,auVar55);
        auVar50 = vfmadd231ps_fma(auVar160,auVar56,auVar54);
        auVar56 = vfmadd231ps_fma(auVar121,auVar112,auVar56);
        auVar130._16_16_ = auVar51;
        auVar130._0_16_ = auVar51;
        auVar142._16_16_ = auVar45;
        auVar142._0_16_ = auVar45;
        auVar152._16_16_ = auVar50;
        auVar152._0_16_ = auVar50;
        auVar84 = vpermps_avx512vl(auVar241._0_32_,ZEXT1632(auVar43));
        auVar71 = vsubps_avx(auVar142,auVar130);
        auVar45 = vfmadd213ps_fma(auVar71,auVar84,auVar130);
        auVar71 = vsubps_avx(auVar152,auVar142);
        auVar64 = vfmadd213ps_fma(auVar71,auVar84,auVar142);
        auVar51 = vsubps_avx(auVar56,auVar50);
        auVar143._16_16_ = auVar51;
        auVar143._0_16_ = auVar51;
        auVar51 = vfmadd213ps_fma(auVar143,auVar84,auVar152);
        auVar71 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar45));
        auVar45 = vfmadd213ps_fma(auVar71,auVar84,ZEXT1632(auVar45));
        auVar71 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar64));
        auVar51 = vfmadd213ps_fma(auVar71,auVar84,ZEXT1632(auVar64));
        auVar71 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar45));
        auVar134 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar71,auVar84);
        auVar71 = vmulps_avx512vl(auVar71,auVar238._0_32_);
        auVar91._16_16_ = auVar71._16_16_;
        fVar102 = fVar209 * 0.33333334;
        auVar161._0_8_ =
             CONCAT44(auVar134._4_4_ + fVar102 * auVar71._4_4_,
                      auVar134._0_4_ + fVar102 * auVar71._0_4_);
        auVar161._8_4_ = auVar134._8_4_ + fVar102 * auVar71._8_4_;
        auVar161._12_4_ = auVar134._12_4_ + fVar102 * auVar71._12_4_;
        auVar137._0_4_ = fVar102 * auVar71._16_4_;
        auVar137._4_4_ = fVar102 * auVar71._20_4_;
        auVar137._8_4_ = fVar102 * auVar71._24_4_;
        auVar137._12_4_ = fVar102 * auVar71._28_4_;
        auVar63 = vsubps_avx((undefined1  [16])0x0,auVar137);
        auVar64 = vshufpd_avx(auVar134,auVar134,3);
        auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar51 = vsubps_avx(auVar64,auVar134);
        auVar45 = vsubps_avx(auVar67,(undefined1  [16])0x0);
        auVar178._0_4_ = auVar51._0_4_ + auVar45._0_4_;
        auVar178._4_4_ = auVar51._4_4_ + auVar45._4_4_;
        auVar178._8_4_ = auVar51._8_4_ + auVar45._8_4_;
        auVar178._12_4_ = auVar51._12_4_ + auVar45._12_4_;
        auVar51 = vshufps_avx(auVar134,auVar134,0xb1);
        auVar45 = vshufps_avx(auVar161,auVar161,0xb1);
        auVar50 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar227._4_4_ = auVar178._0_4_;
        auVar227._0_4_ = auVar178._0_4_;
        auVar227._8_4_ = auVar178._0_4_;
        auVar227._12_4_ = auVar178._0_4_;
        auVar59 = vshufps_avx(auVar178,auVar178,0x55);
        fVar102 = auVar59._0_4_;
        auVar189._0_4_ = auVar51._0_4_ * fVar102;
        fVar205 = auVar59._4_4_;
        auVar189._4_4_ = auVar51._4_4_ * fVar205;
        fVar207 = auVar59._8_4_;
        auVar189._8_4_ = auVar51._8_4_ * fVar207;
        fVar194 = auVar59._12_4_;
        auVar189._12_4_ = auVar51._12_4_ * fVar194;
        auVar196._0_4_ = auVar45._0_4_ * fVar102;
        auVar196._4_4_ = auVar45._4_4_ * fVar205;
        auVar196._8_4_ = auVar45._8_4_ * fVar207;
        auVar196._12_4_ = auVar45._12_4_ * fVar194;
        auVar212._0_4_ = auVar50._0_4_ * fVar102;
        auVar212._4_4_ = auVar50._4_4_ * fVar205;
        auVar212._8_4_ = auVar50._8_4_ * fVar207;
        auVar212._12_4_ = auVar50._12_4_ * fVar194;
        auVar179._0_4_ = auVar56._0_4_ * fVar102;
        auVar179._4_4_ = auVar56._4_4_ * fVar205;
        auVar179._8_4_ = auVar56._8_4_ * fVar207;
        auVar179._12_4_ = auVar56._12_4_ * fVar194;
        auVar51 = vfmadd231ps_fma(auVar189,auVar227,auVar134);
        auVar45 = vfmadd231ps_fma(auVar196,auVar227,auVar161);
        auVar61 = vfmadd231ps_fma(auVar212,auVar227,auVar63);
        auVar62 = vfmadd231ps_fma(auVar179,(undefined1  [16])0x0,auVar227);
        auVar59 = vshufpd_avx(auVar51,auVar51,1);
        auVar60 = vshufpd_avx(auVar45,auVar45,1);
        auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
        auVar58 = vshufpd_avx512vl(auVar62,auVar62,1);
        auVar50 = vminss_avx(auVar51,auVar45);
        auVar51 = vmaxss_avx(auVar45,auVar51);
        auVar56 = vminss_avx(auVar61,auVar62);
        auVar45 = vmaxss_avx(auVar62,auVar61);
        auVar50 = vminss_avx(auVar50,auVar56);
        auVar51 = vmaxss_avx(auVar45,auVar51);
        auVar56 = vminss_avx(auVar59,auVar60);
        auVar45 = vmaxss_avx(auVar60,auVar59);
        auVar59 = vminss_avx512f(auVar57,auVar58);
        auVar60 = vmaxss_avx512f(auVar58,auVar57);
        auVar45 = vmaxss_avx(auVar60,auVar45);
        auVar56 = vminss_avx512f(auVar56,auVar59);
        fVar205 = auVar45._0_4_;
        fVar102 = auVar51._0_4_;
        if (auVar50._0_4_ < 0.0001) {
          bVar42 = fVar205 == -0.0001;
          bVar39 = NAN(fVar205);
          if (fVar205 <= -0.0001) goto LAB_01d36319;
          break;
        }
LAB_01d36319:
        vucomiss_avx512f(auVar56);
        bVar42 = fVar205 <= -0.0001;
        bVar40 = -0.0001 < fVar102;
        bVar39 = bVar42;
        if (!bVar42) break;
        uVar13 = vcmpps_avx512vl(auVar50,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar28 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar42 = bVar40 && bVar28 == 0;
        bVar39 = bVar40 && bVar28 == 0;
      } while (!bVar40 || bVar28 != 0);
      auVar61 = auVar243._0_16_;
      vcmpss_avx512f(auVar50,auVar61,1);
      uVar13 = vcmpss_avx512f(auVar51,auVar61,1);
      bVar40 = (bool)((byte)uVar13 & 1);
      auVar91._0_16_ = auVar244._0_16_;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar244._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      bVar39 = (bool)(!bVar42 | bVar39);
      bVar40 = bVar39 == false;
      auVar93._16_16_ = auVar91._16_16_;
      auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar39 * auVar243._0_4_ + (uint)!bVar39 * 0x7f800000;
      auVar60 = auVar92._0_16_;
      auVar95._16_16_ = auVar91._16_16_;
      auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar39 * auVar243._0_4_ + (uint)!bVar39 * -0x800000;
      auVar59 = auVar94._0_16_;
      uVar13 = vcmpss_avx512f(auVar56,auVar61,1);
      bVar42 = (bool)((byte)uVar13 & 1);
      auVar97._16_16_ = auVar91._16_16_;
      auVar97._0_16_ = auVar244._0_16_;
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * auVar244._0_4_);
      vucomiss_avx512f(auVar96._0_16_);
      if ((bVar39) || (bVar40)) {
        auVar56 = vucomiss_avx512f(auVar50);
        if ((bVar39) || (bVar40)) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar62 = vxorps_avx512vl(auVar50,auVar19);
          auVar50 = vsubss_avx512f(auVar56,auVar50);
          auVar50 = vdivss_avx512f(auVar62,auVar50);
          auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
          auVar56 = vfmadd213ss_avx512f(auVar56,auVar61,auVar50);
          auVar50 = auVar56;
        }
        else {
          auVar50 = vxorps_avx512vl(auVar56,auVar56);
          vucomiss_avx512f(auVar50);
          auVar56 = ZEXT416(0x3f800000);
          if ((bVar39) || (bVar40)) {
            auVar56 = SUB6416(ZEXT464(0xff800000),0);
            auVar50 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar60 = vminss_avx512f(auVar60,auVar50);
        auVar59 = vmaxss_avx(auVar56,auVar59);
      }
      auVar244 = ZEXT464(0x3f800000);
      uVar13 = vcmpss_avx512f(auVar45,auVar61,1);
      bVar42 = (bool)((byte)uVar13 & 1);
      auVar45 = auVar244._0_16_;
      fVar207 = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * 0x3f800000);
      if ((auVar90._0_4_ != fVar207) || (NAN(auVar90._0_4_) || NAN(fVar207))) {
        if ((fVar205 != fVar102) || (NAN(fVar205) || NAN(fVar102))) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar51 = vxorps_avx512vl(auVar51,auVar18);
          auVar180._0_4_ = auVar51._0_4_ / (fVar205 - fVar102);
          auVar180._4_12_ = auVar51._4_12_;
          auVar51 = vsubss_avx512f(auVar45,auVar180);
          auVar51 = vfmadd213ss_avx512f(auVar51,auVar61,auVar180);
          auVar50 = auVar51;
        }
        else if ((fVar102 != 0.0) ||
                (auVar51 = auVar45, auVar50 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar102))) {
          auVar51 = SUB6416(ZEXT464(0xff800000),0);
          auVar50 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar60 = vminss_avx(auVar60,auVar50);
        auVar59 = vmaxss_avx(auVar51,auVar59);
      }
      bVar42 = auVar96._0_4_ != fVar207;
      auVar51 = vminss_avx512f(auVar60,auVar45);
      auVar99._16_16_ = auVar91._16_16_;
      auVar99._0_16_ = auVar60;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (uint)bVar42 * auVar51._0_4_ + (uint)!bVar42 * auVar60._0_4_;
      auVar51 = vmaxss_avx512f(auVar45,auVar59);
      auVar101._16_16_ = auVar91._16_16_;
      auVar101._0_16_ = auVar59;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (uint)bVar42 * auVar51._0_4_ + (uint)!bVar42 * auVar59._0_4_;
      auVar51 = vmaxss_avx512f(auVar61,auVar98._0_16_);
      auVar50 = vminss_avx512f(auVar100._0_16_,auVar45);
    } while (auVar50._0_4_ < auVar51._0_4_);
    auVar61 = vmaxss_avx512f(auVar61,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
    auVar62 = vminss_avx512f(ZEXT416((uint)(auVar50._0_4_ + 0.1)),auVar45);
    auVar122._0_8_ = auVar134._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar197._8_8_ = auVar161._0_8_;
    auVar197._0_8_ = auVar161._0_8_;
    auVar213._8_8_ = auVar63._0_8_;
    auVar213._0_8_ = auVar63._0_8_;
    auVar51 = vshufpd_avx(auVar161,auVar161,3);
    auVar50 = vshufpd_avx(auVar63,auVar63,3);
    auVar56 = vshufps_avx(auVar61,auVar62,0);
    auVar60 = vsubps_avx512vl(auVar44,auVar56);
    fVar102 = auVar56._0_4_;
    auVar149._0_4_ = fVar102 * auVar64._0_4_;
    fVar205 = auVar56._4_4_;
    auVar149._4_4_ = fVar205 * auVar64._4_4_;
    fVar207 = auVar56._8_4_;
    auVar149._8_4_ = fVar207 * auVar64._8_4_;
    fVar194 = auVar56._12_4_;
    auVar149._12_4_ = fVar194 * auVar64._12_4_;
    auVar162._0_4_ = fVar102 * auVar51._0_4_;
    auVar162._4_4_ = fVar205 * auVar51._4_4_;
    auVar162._8_4_ = fVar207 * auVar51._8_4_;
    auVar162._12_4_ = fVar194 * auVar51._12_4_;
    auVar230._0_4_ = auVar50._0_4_ * fVar102;
    auVar230._4_4_ = auVar50._4_4_ * fVar205;
    auVar230._8_4_ = auVar50._8_4_ * fVar207;
    auVar230._12_4_ = auVar50._12_4_ * fVar194;
    auVar138._0_4_ = fVar102 * auVar67._0_4_;
    auVar138._4_4_ = fVar205 * auVar67._4_4_;
    auVar138._8_4_ = fVar207 * auVar67._8_4_;
    auVar138._12_4_ = fVar194 * auVar67._12_4_;
    auVar64 = vfmadd231ps_fma(auVar149,auVar60,auVar122);
    auVar67 = vfmadd231ps_fma(auVar162,auVar60,auVar197);
    auVar59 = vfmadd231ps_fma(auVar230,auVar60,auVar213);
    auVar60 = vfmadd231ps_fma(auVar138,auVar60,ZEXT816(0));
    auVar50 = vsubss_avx512f(auVar45,auVar61);
    auVar51 = vmovshdup_avx(auVar46);
    auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar61._0_4_)),auVar46,auVar50);
    auVar50 = vsubss_avx512f(auVar45,auVar62);
    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar62._0_4_)),auVar46,auVar50);
    auVar63 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar209));
    auVar51 = vsubps_avx(auVar67,auVar64);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar50 = vmulps_avx512vl(auVar51,auVar61);
    auVar51 = vsubps_avx(auVar59,auVar67);
    auVar56 = vmulps_avx512vl(auVar51,auVar61);
    auVar51 = vsubps_avx(auVar60,auVar59);
    auVar51 = vmulps_avx512vl(auVar51,auVar61);
    auVar46 = vminps_avx(auVar56,auVar51);
    auVar51 = vmaxps_avx(auVar56,auVar51);
    auVar46 = vminps_avx(auVar50,auVar46);
    auVar51 = vmaxps_avx(auVar50,auVar51);
    auVar50 = vshufpd_avx(auVar46,auVar46,3);
    auVar56 = vshufpd_avx(auVar51,auVar51,3);
    auVar46 = vminps_avx(auVar46,auVar50);
    auVar51 = vmaxps_avx(auVar51,auVar56);
    fVar209 = auVar63._0_4_;
    auVar181._0_4_ = auVar46._0_4_ * fVar209;
    auVar181._4_4_ = auVar46._4_4_ * fVar209;
    auVar181._8_4_ = auVar46._8_4_ * fVar209;
    auVar181._12_4_ = auVar46._12_4_ * fVar209;
    auVar167._0_4_ = fVar209 * auVar51._0_4_;
    auVar167._4_4_ = fVar209 * auVar51._4_4_;
    auVar167._8_4_ = fVar209 * auVar51._8_4_;
    auVar167._12_4_ = fVar209 * auVar51._12_4_;
    auVar63 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar57._0_4_ - auVar134._0_4_)));
    auVar51 = vshufpd_avx(auVar64,auVar64,3);
    auVar46 = vshufpd_avx(auVar67,auVar67,3);
    auVar50 = vshufpd_avx(auVar59,auVar59,3);
    auVar56 = vshufpd_avx(auVar60,auVar60,3);
    auVar51 = vsubps_avx(auVar51,auVar64);
    auVar64 = vsubps_avx(auVar46,auVar67);
    auVar67 = vsubps_avx(auVar50,auVar59);
    auVar56 = vsubps_avx(auVar56,auVar60);
    auVar46 = vminps_avx(auVar51,auVar64);
    auVar51 = vmaxps_avx(auVar51,auVar64);
    auVar50 = vminps_avx(auVar67,auVar56);
    auVar50 = vminps_avx(auVar46,auVar50);
    auVar46 = vmaxps_avx(auVar67,auVar56);
    auVar51 = vmaxps_avx(auVar51,auVar46);
    fVar209 = auVar63._0_4_;
    auVar214._0_4_ = fVar209 * auVar50._0_4_;
    auVar214._4_4_ = fVar209 * auVar50._4_4_;
    auVar214._8_4_ = fVar209 * auVar50._8_4_;
    auVar214._12_4_ = fVar209 * auVar50._12_4_;
    auVar198._0_4_ = fVar209 * auVar51._0_4_;
    auVar198._4_4_ = fVar209 * auVar51._4_4_;
    auVar198._8_4_ = fVar209 * auVar51._8_4_;
    auVar198._12_4_ = fVar209 * auVar51._12_4_;
    auVar56 = vinsertps_avx(auVar43,auVar134,0x10);
    auVar58 = vpermt2ps_avx512vl(auVar43,_DAT_01feecd0,auVar57);
    auVar113._0_4_ = auVar56._0_4_ + auVar58._0_4_;
    auVar113._4_4_ = auVar56._4_4_ + auVar58._4_4_;
    auVar113._8_4_ = auVar56._8_4_ + auVar58._8_4_;
    auVar113._12_4_ = auVar56._12_4_ + auVar58._12_4_;
    auVar63 = vmulps_avx512vl(auVar113,auVar236._0_16_);
    auVar46 = vshufps_avx(auVar63,auVar63,0x54);
    uVar111 = auVar63._0_4_;
    auVar115._4_4_ = uVar111;
    auVar115._0_4_ = uVar111;
    auVar115._8_4_ = uVar111;
    auVar115._12_4_ = uVar111;
    auVar50 = vfmadd213ps_fma(auVar53,auVar115,auVar4);
    auVar64 = vfmadd213ps_fma(local_158,auVar115,auVar52);
    auVar67 = vfmadd213ps_fma(local_168,auVar115,auVar5);
    auVar51 = vsubps_avx(auVar64,auVar50);
    auVar50 = vfmadd213ps_fma(auVar51,auVar115,auVar50);
    auVar51 = vsubps_avx(auVar67,auVar64);
    auVar51 = vfmadd213ps_fma(auVar51,auVar115,auVar64);
    auVar51 = vsubps_avx(auVar51,auVar50);
    auVar50 = vfmadd231ps_fma(auVar50,auVar51,auVar115);
    auVar59 = vmulps_avx512vl(auVar51,auVar61);
    auVar223._8_8_ = auVar50._0_8_;
    auVar223._0_8_ = auVar50._0_8_;
    auVar51 = vshufpd_avx(auVar50,auVar50,3);
    auVar50 = vshufps_avx(auVar63,auVar63,0x55);
    auVar64 = vsubps_avx(auVar51,auVar223);
    auVar67 = vfmadd231ps_fma(auVar223,auVar50,auVar64);
    auVar231._8_8_ = auVar59._0_8_;
    auVar231._0_8_ = auVar59._0_8_;
    auVar51 = vshufpd_avx(auVar59,auVar59,3);
    auVar51 = vsubps_avx512vl(auVar51,auVar231);
    auVar51 = vfmadd213ps_avx512vl(auVar51,auVar50,auVar231);
    auVar50 = vxorps_avx512vl(auVar64,auVar235._0_16_);
    auVar59 = vmovshdup_avx512vl(auVar51);
    auVar60 = vxorps_avx512vl(auVar59,auVar235._0_16_);
    auVar61 = vmovshdup_avx512vl(auVar64);
    auVar60 = vpermt2ps_avx512vl(auVar60,ZEXT416(5),auVar64);
    auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar59._0_4_ * auVar64._0_4_)),auVar51,auVar61);
    auVar50 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar50);
    auVar139._0_4_ = auVar64._0_4_;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar51 = vdivps_avx(auVar60,auVar139);
    auVar65 = vdivps_avx512vl(auVar50,auVar139);
    fVar209 = auVar67._0_4_;
    auVar50 = vshufps_avx(auVar67,auVar67,0x55);
    auVar224._0_4_ = fVar209 * auVar51._0_4_ + auVar50._0_4_ * auVar65._0_4_;
    auVar224._4_4_ = fVar209 * auVar51._4_4_ + auVar50._4_4_ * auVar65._4_4_;
    auVar224._8_4_ = fVar209 * auVar51._8_4_ + auVar50._8_4_ * auVar65._8_4_;
    auVar224._12_4_ = fVar209 * auVar51._12_4_ + auVar50._12_4_ * auVar65._12_4_;
    auVar61 = vsubps_avx(auVar46,auVar224);
    auVar50 = vmovshdup_avx(auVar51);
    auVar46 = vinsertps_avx(auVar181,auVar214,0x1c);
    auVar232._0_4_ = auVar50._0_4_ * auVar46._0_4_;
    auVar232._4_4_ = auVar50._4_4_ * auVar46._4_4_;
    auVar232._8_4_ = auVar50._8_4_ * auVar46._8_4_;
    auVar232._12_4_ = auVar50._12_4_ * auVar46._12_4_;
    auVar62 = vinsertps_avx512f(auVar167,auVar198,0x1c);
    auVar50 = vmulps_avx512vl(auVar50,auVar62);
    auVar60 = vminps_avx512vl(auVar232,auVar50);
    auVar67 = vmaxps_avx(auVar50,auVar232);
    auVar59 = vmovshdup_avx(auVar65);
    auVar50 = vinsertps_avx(auVar214,auVar181,0x4c);
    auVar215._0_4_ = auVar59._0_4_ * auVar50._0_4_;
    auVar215._4_4_ = auVar59._4_4_ * auVar50._4_4_;
    auVar215._8_4_ = auVar59._8_4_ * auVar50._8_4_;
    auVar215._12_4_ = auVar59._12_4_ * auVar50._12_4_;
    auVar64 = vinsertps_avx(auVar198,auVar167,0x4c);
    auVar199._0_4_ = auVar59._0_4_ * auVar64._0_4_;
    auVar199._4_4_ = auVar59._4_4_ * auVar64._4_4_;
    auVar199._8_4_ = auVar59._8_4_ * auVar64._8_4_;
    auVar199._12_4_ = auVar59._12_4_ * auVar64._12_4_;
    auVar59 = vminps_avx(auVar215,auVar199);
    auVar60 = vaddps_avx512vl(auVar60,auVar59);
    auVar59 = vmaxps_avx(auVar199,auVar215);
    auVar200._0_4_ = auVar67._0_4_ + auVar59._0_4_;
    auVar200._4_4_ = auVar67._4_4_ + auVar59._4_4_;
    auVar200._8_4_ = auVar67._8_4_ + auVar59._8_4_;
    auVar200._12_4_ = auVar67._12_4_ + auVar59._12_4_;
    auVar216._8_8_ = 0x3f80000000000000;
    auVar216._0_8_ = 0x3f80000000000000;
    auVar67 = vsubps_avx(auVar216,auVar200);
    auVar59 = vsubps_avx(auVar216,auVar60);
    auVar60 = vsubps_avx(auVar56,auVar63);
    auVar63 = vsubps_avx(auVar58,auVar63);
    fVar194 = auVar60._0_4_;
    auVar233._0_4_ = fVar194 * auVar67._0_4_;
    fVar204 = auVar60._4_4_;
    auVar233._4_4_ = fVar204 * auVar67._4_4_;
    fVar206 = auVar60._8_4_;
    auVar233._8_4_ = fVar206 * auVar67._8_4_;
    fVar208 = auVar60._12_4_;
    auVar233._12_4_ = fVar208 * auVar67._12_4_;
    auVar66 = vbroadcastss_avx512vl(auVar51);
    auVar46 = vmulps_avx512vl(auVar66,auVar46);
    auVar62 = vmulps_avx512vl(auVar66,auVar62);
    auVar66 = vminps_avx512vl(auVar46,auVar62);
    auVar62 = vmaxps_avx512vl(auVar62,auVar46);
    auVar46 = vbroadcastss_avx512vl(auVar65);
    auVar50 = vmulps_avx512vl(auVar46,auVar50);
    auVar46 = vmulps_avx512vl(auVar46,auVar64);
    auVar64 = vminps_avx512vl(auVar50,auVar46);
    auVar64 = vaddps_avx512vl(auVar66,auVar64);
    auVar60 = vmulps_avx512vl(auVar60,auVar59);
    fVar209 = auVar63._0_4_;
    auVar201._0_4_ = fVar209 * auVar67._0_4_;
    fVar102 = auVar63._4_4_;
    auVar201._4_4_ = fVar102 * auVar67._4_4_;
    fVar205 = auVar63._8_4_;
    auVar201._8_4_ = fVar205 * auVar67._8_4_;
    fVar207 = auVar63._12_4_;
    auVar201._12_4_ = fVar207 * auVar67._12_4_;
    auVar217._0_4_ = fVar209 * auVar59._0_4_;
    auVar217._4_4_ = fVar102 * auVar59._4_4_;
    auVar217._8_4_ = fVar205 * auVar59._8_4_;
    auVar217._12_4_ = fVar207 * auVar59._12_4_;
    auVar46 = vmaxps_avx(auVar46,auVar50);
    auVar168._0_4_ = auVar62._0_4_ + auVar46._0_4_;
    auVar168._4_4_ = auVar62._4_4_ + auVar46._4_4_;
    auVar168._8_4_ = auVar62._8_4_ + auVar46._8_4_;
    auVar168._12_4_ = auVar62._12_4_ + auVar46._12_4_;
    auVar182._8_8_ = 0x3f800000;
    auVar182._0_8_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar182,auVar168);
    auVar50 = vsubps_avx512vl(auVar182,auVar64);
    auVar228._0_4_ = fVar194 * auVar46._0_4_;
    auVar228._4_4_ = fVar204 * auVar46._4_4_;
    auVar228._8_4_ = fVar206 * auVar46._8_4_;
    auVar228._12_4_ = fVar208 * auVar46._12_4_;
    auVar225._0_4_ = fVar194 * auVar50._0_4_;
    auVar225._4_4_ = fVar204 * auVar50._4_4_;
    auVar225._8_4_ = fVar206 * auVar50._8_4_;
    auVar225._12_4_ = fVar208 * auVar50._12_4_;
    auVar169._0_4_ = fVar209 * auVar46._0_4_;
    auVar169._4_4_ = fVar102 * auVar46._4_4_;
    auVar169._8_4_ = fVar205 * auVar46._8_4_;
    auVar169._12_4_ = fVar207 * auVar46._12_4_;
    auVar183._0_4_ = fVar209 * auVar50._0_4_;
    auVar183._4_4_ = fVar102 * auVar50._4_4_;
    auVar183._8_4_ = fVar205 * auVar50._8_4_;
    auVar183._12_4_ = fVar207 * auVar50._12_4_;
    auVar46 = vminps_avx(auVar228,auVar225);
    auVar50 = vminps_avx512vl(auVar169,auVar183);
    auVar64 = vminps_avx512vl(auVar46,auVar50);
    auVar46 = vmaxps_avx(auVar225,auVar228);
    auVar50 = vmaxps_avx(auVar183,auVar169);
    auVar50 = vmaxps_avx(auVar50,auVar46);
    auVar67 = vminps_avx512vl(auVar233,auVar60);
    auVar46 = vminps_avx(auVar201,auVar217);
    auVar46 = vminps_avx(auVar67,auVar46);
    auVar46 = vhaddps_avx(auVar64,auVar46);
    auVar67 = vmaxps_avx512vl(auVar60,auVar233);
    auVar64 = vmaxps_avx(auVar217,auVar201);
    auVar64 = vmaxps_avx(auVar64,auVar67);
    auVar50 = vhaddps_avx(auVar50,auVar64);
    auVar46 = vshufps_avx(auVar46,auVar46,0xe8);
    auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
    auVar170._0_4_ = auVar46._0_4_ + auVar61._0_4_;
    auVar170._4_4_ = auVar46._4_4_ + auVar61._4_4_;
    auVar170._8_4_ = auVar46._8_4_ + auVar61._8_4_;
    auVar170._12_4_ = auVar46._12_4_ + auVar61._12_4_;
    auVar184._0_4_ = auVar50._0_4_ + auVar61._0_4_;
    auVar184._4_4_ = auVar50._4_4_ + auVar61._4_4_;
    auVar184._8_4_ = auVar50._8_4_ + auVar61._8_4_;
    auVar184._12_4_ = auVar50._12_4_ + auVar61._12_4_;
    auVar46 = vmaxps_avx(auVar56,auVar170);
    auVar50 = vminps_avx(auVar184,auVar58);
    uVar35 = vcmpps_avx512vl(auVar50,auVar46,1);
    auVar46 = ZEXT416(5);
    if ((uVar35 & 3) != 0) {
      auVar43 = vxorps_avx512vl(ZEXT416(5),auVar46);
      auVar243 = ZEXT1664(auVar43);
      goto LAB_01d360f2;
    }
    uVar35 = vcmpps_avx512vl(auVar184,auVar58,1);
    uVar13 = vcmpps_avx512vl(auVar43,auVar170,1);
    if (((ushort)uVar13 & (ushort)uVar35 & 1) == 0) {
      bVar28 = 0;
    }
    else {
      auVar50 = vmovshdup_avx(auVar170);
      bVar28 = auVar134._0_4_ < auVar50._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
    }
    auVar46 = vxorps_avx512vl(auVar46,auVar46);
    auVar243 = ZEXT1664(auVar46);
    if (((3 < (uint)uVar30 || uVar8 != 0 && !bVar41) | bVar28) == 1) {
      lVar32 = 200;
      do {
        auVar43 = vsubss_avx512f(auVar45,auVar61);
        fVar205 = auVar43._0_4_;
        fVar209 = fVar205 * fVar205 * fVar205;
        fVar207 = auVar61._0_4_;
        fVar102 = fVar207 * 3.0 * fVar205 * fVar205;
        fVar205 = fVar205 * fVar207 * fVar207 * 3.0;
        auVar128._4_4_ = fVar209;
        auVar128._0_4_ = fVar209;
        auVar128._8_4_ = fVar209;
        auVar128._12_4_ = fVar209;
        auVar123._4_4_ = fVar102;
        auVar123._0_4_ = fVar102;
        auVar123._8_4_ = fVar102;
        auVar123._12_4_ = fVar102;
        auVar104._4_4_ = fVar205;
        auVar104._0_4_ = fVar205;
        auVar104._8_4_ = fVar205;
        auVar104._12_4_ = fVar205;
        fVar207 = fVar207 * fVar207 * fVar207;
        auVar150._0_4_ = (float)local_348._0_4_ * fVar207;
        auVar150._4_4_ = (float)local_348._4_4_ * fVar207;
        auVar150._8_4_ = fStack_340 * fVar207;
        auVar150._12_4_ = fStack_33c * fVar207;
        auVar43 = vfmadd231ps_fma(auVar150,auVar5,auVar104);
        auVar43 = vfmadd231ps_fma(auVar43,auVar52,auVar123);
        auVar43 = vfmadd231ps_fma(auVar43,auVar4,auVar128);
        auVar105._8_8_ = auVar43._0_8_;
        auVar105._0_8_ = auVar43._0_8_;
        auVar43 = vshufpd_avx(auVar43,auVar43,3);
        auVar50 = vshufps_avx(auVar61,auVar61,0x55);
        auVar43 = vsubps_avx(auVar43,auVar105);
        auVar50 = vfmadd213ps_fma(auVar43,auVar50,auVar105);
        fVar209 = auVar50._0_4_;
        auVar43 = vshufps_avx(auVar50,auVar50,0x55);
        auVar106._0_4_ = auVar51._0_4_ * fVar209 + auVar65._0_4_ * auVar43._0_4_;
        auVar106._4_4_ = auVar51._4_4_ * fVar209 + auVar65._4_4_ * auVar43._4_4_;
        auVar106._8_4_ = auVar51._8_4_ * fVar209 + auVar65._8_4_ * auVar43._8_4_;
        auVar106._12_4_ = auVar51._12_4_ * fVar209 + auVar65._12_4_ * auVar43._12_4_;
        auVar61 = vsubps_avx(auVar61,auVar106);
        auVar43 = vandps_avx512vl(auVar50,auVar237._0_16_);
        auVar50 = vprolq_avx512vl(auVar43,0x20);
        auVar43 = vmaxss_avx(auVar50,auVar43);
        bVar41 = auVar43._0_4_ <= (float)local_358._0_4_;
        if (auVar43._0_4_ < (float)local_358._0_4_) {
          auVar43 = vucomiss_avx512f(auVar46);
          if (bVar41) {
            auVar51 = vucomiss_avx512f(auVar43);
            auVar244 = ZEXT1664(auVar51);
            if (bVar41) {
              vmovshdup_avx(auVar43);
              auVar51 = vucomiss_avx512f(auVar46);
              if (bVar41) {
                auVar45 = vucomiss_avx512f(auVar51);
                auVar244 = ZEXT1664(auVar45);
                if (bVar41) {
                  auVar50 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar61 = vinsertps_avx(auVar50,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar50 = vdpps_avx(auVar61,local_178,0x7f);
                  auVar56 = vdpps_avx(auVar61,local_188,0x7f);
                  auVar64 = vdpps_avx(auVar61,local_198,0x7f);
                  auVar67 = vdpps_avx(auVar61,local_1a8,0x7f);
                  auVar59 = vdpps_avx(auVar61,local_1b8,0x7f);
                  auVar60 = vdpps_avx(auVar61,local_1c8,0x7f);
                  auVar63 = vdpps_avx(auVar61,local_1d8,0x7f);
                  auVar61 = vdpps_avx(auVar61,local_1e8,0x7f);
                  auVar62 = vsubss_avx512f(auVar45,auVar51);
                  fVar209 = auVar51._0_4_;
                  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar59._0_4_)),auVar62,auVar50
                                           );
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar209)),auVar62,auVar56
                                           );
                  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar209)),auVar62,auVar64
                                           );
                  auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar61._0_4_)),auVar62,auVar67
                                           );
                  auVar45 = vsubss_avx512f(auVar45,auVar43);
                  auVar163._0_4_ = auVar45._0_4_;
                  fVar209 = auVar163._0_4_ * auVar163._0_4_ * auVar163._0_4_;
                  local_d8 = auVar43._0_4_;
                  fVar102 = local_d8 * 3.0 * auVar163._0_4_ * auVar163._0_4_;
                  fVar205 = auVar163._0_4_ * local_d8 * local_d8 * 3.0;
                  fVar207 = local_d8 * local_d8 * local_d8;
                  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar64._0_4_)),
                                            ZEXT416((uint)fVar205),auVar56);
                  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar102),auVar50);
                  vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar209),auVar51);
                  auVar51 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar41) {
                    fVar194 = *(float *)(ray + k * 4 + 0x80);
                    if (auVar51._0_4_ <= fVar194) {
                      local_c8 = vshufps_avx(auVar43,auVar43,0x55);
                      auVar50 = vsubps_avx512vl(auVar44,local_c8);
                      fVar204 = local_c8._0_4_;
                      auVar185._0_4_ = fVar204 * (float)local_208._0_4_;
                      fVar206 = local_c8._4_4_;
                      auVar185._4_4_ = fVar206 * (float)local_208._4_4_;
                      fVar208 = local_c8._8_4_;
                      auVar185._8_4_ = fVar208 * fStack_200;
                      fVar210 = local_c8._12_4_;
                      auVar185._12_4_ = fVar210 * fStack_1fc;
                      auVar190._0_4_ = fVar204 * (float)local_258._0_4_;
                      auVar190._4_4_ = fVar206 * (float)local_258._4_4_;
                      auVar190._8_4_ = fVar208 * fStack_250;
                      auVar190._12_4_ = fVar210 * fStack_24c;
                      auVar202._0_4_ = fVar204 * (float)local_268._0_4_;
                      auVar202._4_4_ = fVar206 * (float)local_268._4_4_;
                      auVar202._8_4_ = fVar208 * fStack_260;
                      auVar202._12_4_ = fVar210 * fStack_25c;
                      auVar218._0_4_ = fVar204 * (float)local_228._0_4_;
                      auVar218._4_4_ = fVar206 * (float)local_228._4_4_;
                      auVar218._8_4_ = fVar208 * fStack_220;
                      auVar218._12_4_ = fVar210 * fStack_21c;
                      auVar43 = vfmadd231ps_fma(auVar185,auVar50,local_1f8);
                      auVar44 = vfmadd231ps_fma(auVar190,auVar50,local_238);
                      auVar45 = vfmadd231ps_fma(auVar202,auVar50,local_248);
                      auVar50 = vfmadd231ps_fma(auVar218,auVar50,local_218);
                      auVar43 = vsubps_avx(auVar44,auVar43);
                      auVar44 = vsubps_avx(auVar45,auVar44);
                      auVar45 = vsubps_avx(auVar50,auVar45);
                      auVar203._0_4_ = auVar44._0_4_ * local_d8;
                      auVar203._4_4_ = auVar44._4_4_ * local_d8;
                      auVar203._8_4_ = auVar44._8_4_ * local_d8;
                      auVar203._12_4_ = auVar44._12_4_ * local_d8;
                      auVar163._4_4_ = auVar163._0_4_;
                      auVar163._8_4_ = auVar163._0_4_;
                      auVar163._12_4_ = auVar163._0_4_;
                      auVar43 = vfmadd231ps_fma(auVar203,auVar163,auVar43);
                      auVar171._0_4_ = auVar45._0_4_ * local_d8;
                      auVar171._4_4_ = auVar45._4_4_ * local_d8;
                      auVar171._8_4_ = auVar45._8_4_ * local_d8;
                      auVar171._12_4_ = auVar45._12_4_ * local_d8;
                      auVar44 = vfmadd231ps_fma(auVar171,auVar163,auVar44);
                      auVar172._0_4_ = auVar44._0_4_ * local_d8;
                      auVar172._4_4_ = auVar44._4_4_ * local_d8;
                      auVar172._8_4_ = auVar44._8_4_ * local_d8;
                      auVar172._12_4_ = auVar44._12_4_ * local_d8;
                      auVar43 = vfmadd231ps_fma(auVar172,auVar163,auVar43);
                      auVar17._8_4_ = 0x40400000;
                      auVar17._0_8_ = 0x4040000040400000;
                      auVar17._12_4_ = 0x40400000;
                      auVar43 = vmulps_avx512vl(auVar43,auVar17);
                      pGVar9 = (pRVar27->scene->geometries).items[uVar37].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar28 = 0;
                      }
                      else if ((pRVar27->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar28 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_2f8 = auVar73;
                        auVar151._0_4_ = fVar207 * (float)local_2b8._0_4_;
                        auVar151._4_4_ = fVar207 * (float)local_2b8._4_4_;
                        auVar151._8_4_ = fVar207 * fStack_2b0;
                        auVar151._12_4_ = fVar207 * fStack_2ac;
                        auVar140._4_4_ = fVar205;
                        auVar140._0_4_ = fVar205;
                        auVar140._8_4_ = fVar205;
                        auVar140._12_4_ = fVar205;
                        auVar44 = vfmadd132ps_fma(auVar140,auVar151,local_2a8);
                        auVar124._4_4_ = fVar102;
                        auVar124._0_4_ = fVar102;
                        auVar124._8_4_ = fVar102;
                        auVar124._12_4_ = fVar102;
                        auVar44 = vfmadd132ps_fma(auVar124,auVar44,local_298);
                        auVar116._4_4_ = fVar209;
                        auVar116._0_4_ = fVar209;
                        auVar116._8_4_ = fVar209;
                        auVar116._12_4_ = fVar209;
                        auVar50 = vfmadd132ps_fma(auVar116,auVar44,local_288);
                        auVar44 = vshufps_avx(auVar50,auVar50,0xc9);
                        auVar45 = vshufps_avx(auVar43,auVar43,0xc9);
                        auVar117._0_4_ = auVar50._0_4_ * auVar45._0_4_;
                        auVar117._4_4_ = auVar50._4_4_ * auVar45._4_4_;
                        auVar117._8_4_ = auVar50._8_4_ * auVar45._8_4_;
                        auVar117._12_4_ = auVar50._12_4_ * auVar45._12_4_;
                        auVar44 = vfmsub231ps_fma(auVar117,auVar43,auVar44);
                        auVar43 = vshufps_avx(auVar44,auVar44,0x55);
                        local_f8 = vshufps_avx(auVar44,auVar44,0xaa);
                        local_e8 = auVar44._0_4_;
                        local_108[0] = (RTCHitN)auVar43[0];
                        local_108[1] = (RTCHitN)auVar43[1];
                        local_108[2] = (RTCHitN)auVar43[2];
                        local_108[3] = (RTCHitN)auVar43[3];
                        local_108[4] = (RTCHitN)auVar43[4];
                        local_108[5] = (RTCHitN)auVar43[5];
                        local_108[6] = (RTCHitN)auVar43[6];
                        local_108[7] = (RTCHitN)auVar43[7];
                        local_108[8] = (RTCHitN)auVar43[8];
                        local_108[9] = (RTCHitN)auVar43[9];
                        local_108[10] = (RTCHitN)auVar43[10];
                        local_108[0xb] = (RTCHitN)auVar43[0xb];
                        local_108[0xc] = (RTCHitN)auVar43[0xc];
                        local_108[0xd] = (RTCHitN)auVar43[0xd];
                        local_108[0xe] = (RTCHitN)auVar43[0xe];
                        local_108[0xf] = (RTCHitN)auVar43[0xf];
                        uStack_e4 = local_e8;
                        uStack_e0 = local_e8;
                        uStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        local_b8 = local_278._0_8_;
                        uStack_b0 = local_278._8_8_;
                        local_a8 = local_2c8;
                        vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                        uStack_94 = pRVar27->user->instID[0];
                        local_98 = uStack_94;
                        uStack_90 = uStack_94;
                        uStack_8c = uStack_94;
                        uStack_88 = pRVar27->user->instPrimID[0];
                        uStack_84 = uStack_88;
                        uStack_80 = uStack_88;
                        uStack_7c = uStack_88;
                        *(float *)(ray + k * 4 + 0x80) = auVar51._0_4_;
                        local_378 = local_2d8;
                        local_328.valid = (int *)local_378;
                        local_328.geometryUserPtr = pGVar9->userPtr;
                        local_328.context = pRVar27->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = local_108;
                        local_328.N = 4;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_328);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar240 = ZEXT1664(auVar43);
                        }
                        uVar35 = vptestmd_avx512vl(local_378,local_378);
                        if ((uVar35 & 0xf) == 0) {
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar235 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar236 = ZEXT1664(auVar43);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar237 = ZEXT1664(auVar43);
                          auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar238 = ZEXT3264(auVar73);
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar239 = ZEXT1664(auVar43);
                          auVar241 = ZEXT3264(_DAT_01feed20);
                          auVar43 = vxorps_avx512vl(auVar46,auVar46);
                          auVar243 = ZEXT1664(auVar43);
                          auVar242 = ZEXT3264(local_2f8);
                        }
                        else {
                          p_Var10 = pRVar27->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar235 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar236 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar237 = ZEXT1664(auVar43);
                            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar238 = ZEXT3264(auVar73);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar239 = ZEXT1664(auVar43);
                            auVar241 = ZEXT3264(_DAT_01feed20);
                            auVar43 = vxorps_avx512vl(auVar46,auVar46);
                            auVar243 = ZEXT1664(auVar43);
                            auVar242 = ZEXT3264(local_2f8);
                          }
                          else {
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar235 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar236 = ZEXT1664(auVar43);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar237 = ZEXT1664(auVar43);
                            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar238 = ZEXT3264(auVar73);
                            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar239 = ZEXT1664(auVar43);
                            auVar241 = ZEXT3264(_DAT_01feed20);
                            auVar43 = vxorps_avx512vl(auVar46,auVar46);
                            auVar243 = ZEXT1664(auVar43);
                            auVar242 = ZEXT3264(local_2f8);
                            if (((pRVar27->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_328);
                              auVar242 = ZEXT3264(local_2f8);
                              auVar43 = vxorps_avx512vl(auVar43,auVar43);
                              auVar243 = ZEXT1664(auVar43);
                              auVar241 = ZEXT3264(_DAT_01feed20);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar240 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar239 = ZEXT1664(auVar43);
                              auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar238 = ZEXT3264(auVar73);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar237 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar236 = ZEXT1664(auVar43);
                              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar235 = ZEXT1664(auVar43);
                            }
                          }
                          auVar244 = ZEXT464(0x3f800000);
                          uVar35 = vptestmd_avx512vl(local_378,local_378);
                          uVar35 = uVar35 & 0xf;
                          auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar41 = (bool)((byte)uVar35 & 1);
                          bVar42 = (bool)((byte)(uVar35 >> 1) & 1);
                          bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
                          bVar40 = SUB81(uVar35 >> 3,0);
                          *(uint *)(local_328.ray + 0x80) =
                               (uint)bVar41 * auVar43._0_4_ |
                               (uint)!bVar41 * *(int *)(local_328.ray + 0x80);
                          *(uint *)(local_328.ray + 0x84) =
                               (uint)bVar42 * auVar43._4_4_ |
                               (uint)!bVar42 * *(int *)(local_328.ray + 0x84);
                          *(uint *)(local_328.ray + 0x88) =
                               (uint)bVar39 * auVar43._8_4_ |
                               (uint)!bVar39 * *(int *)(local_328.ray + 0x88);
                          *(uint *)(local_328.ray + 0x8c) =
                               (uint)bVar40 * auVar43._12_4_ |
                               (uint)!bVar40 * *(int *)(local_328.ray + 0x8c);
                          bVar28 = 1;
                          if ((byte)uVar35 != 0) goto LAB_01d36f74;
                        }
                        auVar244 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x80) = fVar194;
                        bVar28 = 0;
                      }
LAB_01d36f74:
                      bVar36 = (bool)(bVar36 | bVar28);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01d360f2;
    }
    auVar46 = vinsertps_avx(auVar134,auVar57,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }